

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_tree(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  xmlNodePtr pxVar32;
  xmlBufferPtr pxVar33;
  xmlDocPtr pxVar34;
  xmlAttrPtr pxVar35;
  long lVar36;
  undefined8 uVar37;
  xmlDocPtr pxVar38;
  xmlDocPtr pxVar39;
  xmlDocPtr pxVar40;
  ulong uVar41;
  FILE *pFVar42;
  xmlNodePtr pxVar43;
  xmlNodePtr pxVar44;
  xmlNodePtr val;
  xmlChar *pxVar45;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int nr_08;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int nr_09;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int nr_10;
  int nr_11;
  int nr_12;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int nr_17;
  int nr_18;
  int nr_19;
  int nr_20;
  int nr_21;
  int nr_22;
  int nr_23;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int nr_24;
  int nr_25;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int nr_26;
  int nr_27;
  int nr_28;
  int test_ret_8;
  undefined4 *puVar46;
  xmlNs *pxVar47;
  undefined *puVar48;
  int n_parent;
  uint uVar49;
  int iVar50;
  uint uVar51;
  undefined4 uVar52;
  xmlDocPtr in_RSI;
  char *pcVar53;
  undefined8 uVar54;
  undefined4 uVar55;
  int n_cur;
  uint uVar56;
  int n_string;
  uint uVar57;
  uint uVar58;
  int iVar59;
  int n_options;
  uint *puVar60;
  char *pcVar61;
  int n_str;
  undefined8 *puVar62;
  int *piVar63;
  bool bVar64;
  undefined1 auVar65 [12];
  int test_ret_1;
  int test_ret;
  int test_ret_4;
  int test_ret_2;
  int test_ret_3;
  int test_ret_33;
  int test_ret_18;
  int test_ret_17;
  int test_ret_16;
  
  if (quiet == '\0') {
    puts("Testing tree : 144 of 170 functions ...");
  }
  uVar49 = 0;
  iVar19 = 0;
  do {
    uVar56 = 0;
    do {
      iVar2 = (int)in_RSI;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar2);
      if (uVar56 == 0) {
        uVar37 = xmlNewPI("test",0);
      }
      else {
        uVar37 = 0;
      }
      pxVar32 = (xmlNodePtr)xmlAddChild(in_RSI,uVar37);
      if (pxVar32 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar37);
      }
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)in_RSI,nr);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChild",(ulong)(uint)(iVar2 - iVar1));
        iVar19 = iVar19 + 1;
        printf(" %d",(ulong)uVar49);
        in_RSI = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar1 = 0;
  do {
    uVar49 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar4);
      if (uVar49 == 0) {
        uVar37 = xmlNewPI("test",0);
      }
      else {
        uVar37 = 0;
      }
      pxVar32 = (xmlNodePtr)xmlAddChildList(in_RSI,uVar37);
      if (pxVar32 == (xmlNodePtr)0x0) {
        xmlFreeNodeList(uVar37);
      }
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar2,(xmlNodePtr)in_RSI,nr_00);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChildList",(ulong)(uint)(iVar4 - iVar3));
        iVar1 = iVar1 + 1;
        printf(" %d",iVar2);
        in_RSI = (xmlDocPtr)(ulong)uVar49;
        printf(" %d");
        putchar(10);
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 != 3);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar2 = 0;
  do {
    uVar56 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar4);
      if (uVar56 == 0) {
        uVar37 = xmlNewPI("test",0);
      }
      else {
        uVar37 = 0;
      }
      pxVar32 = (xmlNodePtr)xmlAddNextSibling(in_RSI,uVar37);
      if (pxVar32 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar37);
      }
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)in_RSI,nr_01);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddNextSibling",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar49);
        in_RSI = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar3 = 0;
  do {
    uVar56 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar5);
      if (uVar56 == 0) {
        uVar37 = xmlNewPI("test",0);
      }
      else {
        uVar37 = 0;
      }
      pxVar32 = (xmlNodePtr)xmlAddPrevSibling(in_RSI,uVar37);
      if (pxVar32 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar37);
      }
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)in_RSI,nr_02);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddPrevSibling",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar49);
        in_RSI = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar4 = 0;
  do {
    uVar56 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar6);
      if (uVar56 == 0) {
        uVar37 = xmlNewPI("test",0);
      }
      else {
        uVar37 = 0;
      }
      pxVar32 = (xmlNodePtr)xmlAddSibling(in_RSI,uVar37);
      if (pxVar32 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar37);
      }
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)in_RSI,nr_03);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddSibling",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar49);
        in_RSI = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar40 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)in_RSI;
          iVar6 = xmlMemBlocks();
          pxVar33 = gen_xmlBufferPtr(uVar49,iVar7);
          pxVar34 = gen_xmlDocPtr(uVar56,iVar7);
          pxVar35 = gen_xmlAttrPtr(uVar58,iVar7);
          uVar57 = (uint)pxVar40;
          if (uVar57 < 4) {
            uVar37 = *puVar62;
          }
          else {
            uVar37 = 0;
          }
          in_RSI = pxVar34;
          xmlAttrSerializeTxtContent(pxVar33,pxVar34,pxVar35,uVar37);
          call_tests = call_tests + 1;
          if (pxVar33 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar33);
          }
          if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
            xmlFreeDoc(pxVar34);
          }
          if (uVar58 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlAttrSerializeTxtContent",
                   (ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",(ulong)uVar58);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar40;
          }
          uVar57 = uVar57 + 1;
          pxVar40 = (xmlDocPtr)(ulong)uVar57;
          puVar62 = puVar62 + 1;
        } while (uVar57 != 5);
        bVar64 = uVar58 == 0;
        uVar58 = uVar58 + 1;
      } while (bVar64);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar36 = xmlBufContent(0);
  if (lVar36 != 0) {
    (*_xmlFree)(lVar36);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  lVar36 = xmlBufEnd(0);
  if (lVar36 != 0) {
    (*_xmlFree)(lVar36);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufEnd");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  pcVar53 = (char *)0x0;
  xmlBufGetNodeContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufGetNodeContent");
    printf(" %d");
    pcVar53 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar49 = 0;
  do {
    iVar50 = 0;
    do {
      piVar63 = &DAT_00157174;
      uVar56 = 0;
      do {
        iVar14 = (int)pcVar53;
        iVar12 = xmlMemBlocks();
        pxVar33 = gen_xmlBufferPtr(uVar49,iVar14);
        switch(iVar50) {
        case 0:
          bVar64 = false;
          pcVar53 = "foo";
          break;
        case 1:
          bVar64 = false;
          pcVar53 = "<foo/>";
          break;
        case 2:
          bVar64 = false;
          pcVar53 = anon_var_dwarf_197;
          break;
        case 3:
          bVar64 = false;
          pcVar53 = " 2ab ";
          break;
        default:
          bVar64 = true;
          pcVar53 = (char *)0x0;
        }
        iVar14 = -1;
        if (uVar56 < 4) {
          iVar14 = *piVar63;
        }
        if ((!bVar64) && (iVar13 = xmlStrlen(pcVar53), iVar13 < iVar14)) {
          iVar14 = 0;
        }
        xmlBufferAdd(pxVar33,pcVar53,iVar14);
        call_tests = call_tests + 1;
        if (pxVar33 != (xmlBufferPtr)0x0) {
          xmlBufferFree(pxVar33);
        }
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar12 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlBufferAdd",(ulong)(uint)(iVar14 - iVar12));
          iVar20 = iVar20 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",iVar50);
          pcVar53 = (char *)(ulong)uVar56;
          printf(" %d");
          putchar(10);
        }
        uVar56 = uVar56 + 1;
        piVar63 = piVar63 + 1;
      } while (uVar56 != 4);
      iVar50 = iVar50 + 1;
    } while (iVar50 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar50 = 0;
  uVar49 = 0;
  do {
    iVar12 = 0;
    do {
      uVar56 = 0;
      piVar63 = &DAT_00157174;
      do {
        iVar13 = (int)pcVar53;
        iVar14 = xmlMemBlocks();
        pxVar33 = gen_xmlBufferPtr(uVar49,iVar13);
        switch(iVar12) {
        case 0:
          bVar64 = false;
          pcVar53 = "foo";
          break;
        case 1:
          bVar64 = false;
          pcVar53 = "<foo/>";
          break;
        case 2:
          bVar64 = false;
          pcVar53 = anon_var_dwarf_197;
          break;
        case 3:
          bVar64 = false;
          pcVar53 = " 2ab ";
          break;
        default:
          bVar64 = true;
          pcVar53 = (char *)0x0;
        }
        iVar13 = -1;
        if (uVar56 < 4) {
          iVar13 = *piVar63;
        }
        if ((!bVar64) && (iVar15 = xmlStrlen(pcVar53), iVar15 < iVar13)) {
          iVar13 = 0;
        }
        xmlBufferAddHead(pxVar33,pcVar53,iVar13);
        call_tests = call_tests + 1;
        if (pxVar33 != (xmlBufferPtr)0x0) {
          xmlBufferFree(pxVar33);
        }
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar14 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlBufferAddHead",(ulong)(uint)(iVar13 - iVar14));
          iVar50 = iVar50 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",iVar12);
          pcVar53 = (char *)(ulong)uVar56;
          printf(" %d");
          putchar(10);
        }
        uVar56 = uVar56 + 1;
        piVar63 = piVar63 + 1;
      } while (uVar56 != 4);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d48;
    pcVar61 = (char *)0x0;
    do {
      iVar14 = (int)pcVar53;
      iVar12 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar14);
      uVar56 = (uint)pcVar61;
      if (uVar56 < 3) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      xmlBufferCCat(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar12 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCCat",(ulong)(uint)(iVar14 - iVar12));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pcVar53 = pcVar61;
      }
      uVar56 = uVar56 + 1;
      pcVar61 = (char *)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pcVar61 = (char *)0x0;
    do {
      iVar13 = (int)pcVar53;
      iVar14 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar13);
      uVar56 = (uint)pcVar61;
      if (uVar56 < 4) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      xmlBufferCat(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar14 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCat",(ulong)(uint)(iVar13 - iVar14));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pcVar53 = pcVar61;
      }
      uVar56 = uVar56 + 1;
      pcVar61 = (char *)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar12 = test_ret_1 + iVar12;
  iVar14 = xmlMemBlocks();
  xmlBufferContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar14 != iVar13) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferContent");
    pcVar53 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  uVar37 = xmlBufferCreate();
  xmlBufferFree(uVar37);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    pcVar53 = (char *)(ulong)(uint)(iVar17 - iVar15);
    printf("Leak of %d blocks found in xmlBufferCreate");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar49 = 0;
  test_ret_1 = 0;
  do {
    iVar17 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(uVar49,(int)pcVar53);
    lVar36 = xmlBufferDetach(pxVar33);
    if (lVar36 != 0) {
      (*_xmlFree)(lVar36);
    }
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferDetach",(ulong)(uint)(iVar18 - iVar17));
      test_ret_1 = test_ret_1 + 1;
      pcVar53 = (char *)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  uVar49 = 0;
  test_ret = 0;
  do {
    iVar17 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(uVar49,(int)pcVar53);
    xmlBufferEmpty(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferEmpty",(ulong)(uint)(iVar18 - iVar17));
      test_ret = test_ret + 1;
      pcVar53 = (char *)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  test_ret_4 = (int)(iVar15 != iVar16);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar49 = 0;
  do {
    puVar60 = &DAT_0014b1f8;
    pcVar61 = (char *)0x0;
    do {
      iVar17 = (int)pcVar53;
      iVar16 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar17);
      pcVar53 = (char *)0xffffffff;
      uVar56 = (uint)pcVar61;
      if (uVar56 < 3) {
        pcVar53 = (char *)(ulong)*puVar60;
      }
      xmlBufferGrow(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferGrow",(ulong)(uint)(iVar17 - iVar16));
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pcVar53 = pcVar61;
      }
      uVar56 = uVar56 + 1;
      pcVar61 = (char *)(ulong)uVar56;
      puVar60 = puVar60 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar2 = iVar1 + iVar19 + iVar2 + iVar3 + iVar4 + iVar5 + (uint)(iVar6 != iVar7) +
          (uint)(iVar8 != iVar9) + (uint)(iVar10 != iVar11) + iVar20 + iVar50 + iVar12 +
          (uint)(iVar14 != iVar13) + test_ret_4 + test_ret_1;
  function_tests = function_tests + 1;
  iVar15 = test_ret + iVar15;
  iVar19 = xmlMemBlocks();
  xmlBufferLength(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar1 = xmlMemBlocks();
  if (iVar19 != iVar1) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferLength");
    pcVar53 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    puVar60 = &DAT_0014b1f8;
    do {
      iVar4 = (int)pcVar53;
      iVar3 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar4);
      pcVar53 = (char *)0xffffffff;
      if (uVar56 < 3) {
        pcVar53 = (char *)(ulong)*puVar60;
      }
      xmlBufferResize(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferResize",(ulong)(uint)(iVar4 - iVar3));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar49);
        pcVar53 = (char *)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar60 = puVar60 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0xffffffff;
    do {
      iVar5 = (int)pcVar53;
      iVar4 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar5);
      pcVar53 = (char *)0x0;
      if (uVar56 < 3) {
        pcVar53 = (char *)(ulong)(uint)(&DAT_0014b204)[uVar56];
      }
      xmlBufferSetAllocationScheme(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      uVar56 = uVar56 + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferSetAllocationScheme",
               (ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar49);
        pcVar53 = (char *)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    puVar60 = &DAT_0014b1f8;
    uVar56 = 0;
    do {
      iVar5 = (int)pcVar53;
      iVar4 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar5);
      pcVar53 = (char *)0xffffffff;
      if (uVar56 < 3) {
        pcVar53 = (char *)(ulong)*puVar60;
      }
      xmlBufferShrink(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferShrink",(ulong)(uint)(iVar5 - iVar4));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar49);
        pcVar53 = (char *)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar60 = puVar60 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar19 = iVar2 + iVar15 + (uint)(iVar19 != iVar1) + test_ret_1;
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    uVar56 = 0;
    do {
      iVar2 = (int)pcVar53;
      iVar1 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar2);
      if (uVar56 < 4) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      xmlBufferWriteCHAR(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteCHAR",(ulong)(uint)(iVar2 - iVar1));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar49);
        pcVar53 = (char *)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d48;
    uVar56 = 0;
    do {
      iVar4 = (int)pcVar53;
      iVar2 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar4);
      if (uVar56 < 3) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      xmlBufferWriteChar(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar2 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteChar",(ulong)(uint)(iVar4 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar49);
        pcVar53 = (char *)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar19 = iVar19 + iVar3 + test_ret;
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    uVar56 = 0;
    do {
      iVar3 = (int)pcVar53;
      iVar2 = xmlMemBlocks();
      pxVar33 = gen_xmlBufferPtr(uVar49,iVar3);
      if (uVar56 < 4) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      xmlBufferWriteQuotedString(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar33);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteQuotedString",(ulong)(uint)(iVar3 - iVar2))
        ;
        test_ret_17 = test_ret_17 + 1;
        printf(" %d",(ulong)uVar49);
        pcVar53 = (char *)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar49 = 0;
  do {
    iVar2 = 0;
    do {
      uVar41 = 0;
      do {
        iVar3 = (int)uVar41;
        pxVar45 = (xmlChar *)0x0;
        if (iVar3 == 0) {
          pxVar45 = chartab;
        }
        piVar63 = &DAT_00157174;
        pxVar40 = (xmlDocPtr)0x0;
        do {
          iVar4 = xmlMemBlocks();
          if (uVar49 < 4) {
            pxVar34 = (xmlDocPtr)(&DAT_00159d60)[uVar49];
          }
          else {
            pxVar34 = (xmlDocPtr)0x0;
          }
          switch(iVar2) {
          case 0:
            bVar64 = false;
            pcVar53 = "foo";
            break;
          case 1:
            bVar64 = false;
            pcVar53 = "<foo/>";
            break;
          case 2:
            bVar64 = false;
            pcVar53 = anon_var_dwarf_197;
            break;
          case 3:
            bVar64 = false;
            pcVar53 = " 2ab ";
            break;
          default:
            bVar64 = true;
            pcVar53 = (char *)0x0;
          }
          iVar5 = -1;
          uVar56 = (uint)pxVar40;
          if (uVar56 < 4) {
            iVar5 = *piVar63;
          }
          if ((!bVar64) && (iVar6 = xmlStrlen(pcVar53), iVar6 < iVar5)) {
            iVar5 = 0;
          }
          pxVar39 = (xmlDocPtr)pcVar53;
          pxVar38 = (xmlDocPtr)xmlBuildQName(pxVar34,pcVar53,pxVar45,iVar5);
          if ((((pxVar38 != (xmlDocPtr)pxVar45) && (pxVar38 != (xmlDocPtr)pcVar53)) &&
              (pxVar38 != (xmlDocPtr)0x0)) && (pxVar38 != pxVar34)) {
            (*_xmlFree)(pxVar38);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBuildQName",(ulong)(uint)(iVar5 - iVar4));
            test_ret_18 = test_ret_18 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",iVar2);
            printf(" %d",uVar41);
            printf(" %d");
            putchar(10);
            pxVar39 = pxVar40;
          }
          uVar56 = uVar56 + 1;
          pxVar40 = (xmlDocPtr)(ulong)uVar56;
          piVar63 = piVar63 + 1;
        } while (uVar56 != 4);
        uVar41 = (ulong)(iVar3 + 1);
      } while (iVar3 == 0);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  uVar49 = 0;
  test_ret = 0;
  do {
    iVar3 = (int)pxVar39;
    iVar2 = xmlMemBlocks();
    pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar3);
    xmlChildElementCount(pxVar39);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,nr_04);
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlChildElementCount",(ulong)(uint)(iVar3 - iVar2));
      test_ret = test_ret + 1;
      pxVar39 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar49 = 0;
  do {
    puVar60 = &DAT_00157174;
    pxVar40 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar39;
      iVar3 = xmlMemBlocks();
      pxVar34 = gen_xmlDocPtr(uVar49,iVar4);
      pxVar39 = (xmlDocPtr)0xffffffff;
      uVar56 = (uint)pxVar40;
      if (uVar56 < 4) {
        pxVar39 = (xmlDocPtr)(ulong)*puVar60;
      }
      pxVar38 = (xmlDocPtr)xmlCopyDoc(pxVar34);
      if (api_doc != pxVar38) {
        xmlFreeDoc(pxVar38);
      }
      call_tests = call_tests + 1;
      if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
        xmlFreeDoc(pxVar34);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyDoc",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar39 = pxVar40;
      }
      uVar56 = uVar56 + 1;
      pxVar40 = (xmlDocPtr)(ulong)uVar56;
      puVar60 = puVar60 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar3 = 0;
  do {
    iVar5 = (int)pxVar39;
    iVar4 = xmlMemBlocks();
    pxVar39 = (xmlDocPtr)gen_xmlDtdPtr(uVar49,iVar5);
    pxVar32 = (xmlNodePtr)xmlCopyDtd(pxVar39);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    des_xmlDtdPtr(uVar49,(xmlDtdPtr)pxVar39,nr_05);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyDtd",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      pxVar39 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar19 = iVar19 + test_ret_1 + iVar1 + test_ret_17 + test_ret_18 + test_ret;
  function_tests = function_tests + 1;
  uVar49 = 0;
  test_ret = 0;
  do {
    iVar1 = xmlMemBlocks();
    if (uVar49 == 0) {
      get_api_root();
      pxVar47 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        pxVar47 = api_root->nsDef;
        api_ns = pxVar47;
      }
    }
    else {
      pxVar47 = (xmlNs *)0x0;
    }
    lVar36 = xmlCopyNamespace(pxVar47);
    if (lVar36 != 0) {
      xmlFreeNs();
    }
    call_tests = call_tests + 1;
    if (uVar49 == 0) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar1 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespace",(ulong)(uint)(iVar4 - iVar1));
      test_ret = test_ret + 1;
      pxVar39 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 == 1);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar1 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar49 == 0) {
      get_api_root();
      pxVar47 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        pxVar47 = api_root->nsDef;
        api_ns = pxVar47;
      }
    }
    else {
      pxVar47 = (xmlNs *)0x0;
    }
    lVar36 = xmlCopyNamespaceList(pxVar47);
    if (lVar36 != 0) {
      xmlFreeNsList();
    }
    call_tests = call_tests + 1;
    if (uVar49 == 0) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespaceList",(ulong)(uint)(iVar5 - iVar4));
      iVar1 = iVar1 + 1;
      pxVar39 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 == 1);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    pxVar40 = (xmlDocPtr)0x0;
    do {
      iVar6 = (int)pxVar39;
      iVar5 = xmlMemBlocks();
      pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar6);
      uVar52 = 0xffffffff;
      uVar56 = (uint)pxVar40;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      pxVar32 = (xmlNodePtr)xmlCopyNode(pxVar39,uVar52);
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,nr_06);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyNode",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar39 = pxVar40;
      }
      uVar56 = uVar56 + 1;
      pxVar40 = (xmlDocPtr)(ulong)uVar56;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar19 = iVar19 + iVar2 + iVar3 + test_ret;
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar2 = 0;
  do {
    iVar5 = (int)pxVar39;
    iVar3 = xmlMemBlocks();
    pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar5);
    pxVar32 = (xmlNodePtr)xmlCopyNodeList(pxVar39);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,nr_07);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar3 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNodeList",(ulong)(uint)(iVar5 - iVar3));
      iVar2 = iVar2 + 1;
      pxVar39 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar3 = (int)pxVar39;
      iVar5 = xmlMemBlocks();
      pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar3);
      pxVar35 = gen_xmlAttrPtr(uVar56,iVar3);
      auVar65 = xmlCopyProp(pxVar39,pxVar35);
      iVar3 = auVar65._8_4_;
      lVar36 = auVar65._0_8_;
      if (lVar36 != 0) {
        xmlUnlinkNode(lVar36);
        xmlFreeNode(lVar36);
        iVar3 = extraout_EDX;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,iVar3);
      if (uVar56 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar5 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyProp",(ulong)(uint)(iVar3 - iVar5));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar49);
        pxVar39 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 == 1);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar3 = (int)pxVar39;
      iVar5 = xmlMemBlocks();
      pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar3);
      pxVar35 = gen_xmlAttrPtr(uVar56,iVar3);
      auVar65 = xmlCopyPropList(pxVar39,pxVar35);
      iVar3 = auVar65._8_4_;
      lVar36 = auVar65._0_8_;
      if (lVar36 != 0) {
        xmlUnlinkNode(lVar36);
        xmlFreeNode(lVar36);
        iVar3 = extraout_EDX_00;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,iVar3);
      if (uVar56 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar5 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyPropList",(ulong)(uint)(iVar3 - iVar5));
        test_ret_18 = test_ret_18 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar39 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 == 1);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar41 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar40 = (xmlDocPtr)0x0;
        do {
          iVar5 = (int)pxVar39;
          iVar3 = xmlMemBlocks();
          pxVar34 = gen_xmlDocPtr(uVar49,iVar5);
          if (uVar56 < 4) {
            pxVar39 = (xmlDocPtr)(&DAT_00159d60)[uVar56];
          }
          else {
            pxVar39 = (xmlDocPtr)0x0;
          }
          if ((uint)uVar41 < 4) {
            uVar37 = (&DAT_00159d60)[uVar41];
          }
          else {
            uVar37 = 0;
          }
          uVar58 = (uint)pxVar40;
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          pxVar32 = (xmlNodePtr)xmlCreateIntSubset(pxVar34,pxVar39,uVar37,uVar54);
          desret_xmlNodePtr(pxVar32);
          call_tests = call_tests + 1;
          if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
            xmlFreeDoc(pxVar34);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar3 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCreateIntSubset",(ulong)(uint)(iVar5 - iVar3));
            test_ret_17 = test_ret_17 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",uVar41);
            printf(" %d");
            putchar(10);
            pxVar39 = pxVar40;
          }
          uVar58 = uVar58 + 1;
          pxVar40 = (xmlDocPtr)(ulong)uVar58;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        uVar58 = (uint)uVar41 + 1;
        uVar41 = (ulong)uVar58;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar49 = 0;
  do {
    iVar5 = 0;
    do {
      uVar56 = 0;
      do {
        iVar6 = 0;
        do {
          pxVar40 = (xmlDocPtr)0x0;
          puVar46 = &DAT_00157174;
          do {
            iVar8 = (int)pxVar39;
            iVar7 = xmlMemBlocks();
            pxVar34 = gen_xmlDocPtr(uVar49,iVar8);
            pxVar32 = gen_xmlNodePtr(iVar5,iVar8);
            pxVar38 = gen_xmlDocPtr(uVar56,iVar8);
            pxVar39 = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar8);
            uVar52 = 0xffffffff;
            uVar58 = (uint)pxVar40;
            if (uVar58 < 4) {
              uVar52 = *puVar46;
            }
            xmlDOMWrapAdoptNode(0,pxVar34,pxVar32,pxVar38,pxVar39,uVar52);
            pxVar43 = (xmlNodePtr)0x0;
            iVar8 = extraout_EDX_01;
            if ((pxVar32 != (xmlNodePtr)0x0) &&
               (pxVar43 = pxVar32, pxVar32->parent == (_xmlNode *)0x0)) {
              xmlUnlinkNode(pxVar32);
              xmlFreeNode(pxVar32);
              pxVar43 = (xmlNodePtr)0x0;
              iVar8 = extraout_EDX_02;
            }
            call_tests = call_tests + 1;
            if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc))
            {
              xmlFreeDoc(pxVar34);
              iVar8 = extraout_EDX_03;
            }
            des_xmlNodePtr(iVar5,pxVar43,iVar8);
            iVar8 = extraout_EDX_04;
            if (((pxVar38 != (xmlDocPtr)0x0) && (api_doc != pxVar38)) && (pxVar38->doc != api_doc))
            {
              xmlFreeDoc(pxVar38);
              iVar8 = extraout_EDX_05;
            }
            des_xmlNodePtr(iVar6,(xmlNodePtr)pxVar39,iVar8);
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar7 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDOMWrapAdoptNode",(ulong)(uint)(iVar8 - iVar7));
              iVar3 = iVar3 + 1;
              printf(" %d",0);
              printf(" %d",(ulong)uVar49);
              printf(" %d",iVar5);
              printf(" %d",(ulong)uVar56);
              printf(" %d",iVar6);
              printf(" %d");
              putchar(10);
              pxVar39 = pxVar40;
            }
            uVar58 = uVar58 + 1;
            pxVar40 = (xmlDocPtr)(ulong)uVar58;
            puVar46 = puVar46 + 1;
          } while (uVar58 != 4);
          iVar6 = iVar6 + 1;
        } while (iVar6 != 3);
        uVar56 = uVar56 + 1;
      } while (uVar56 != 4);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  iVar19 = iVar19 + iVar1 + iVar4 + iVar2 + test_ret + test_ret_18;
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      do {
        iVar1 = 0;
        do {
          uVar57 = 0;
          do {
            puVar46 = &DAT_00157174;
            pxVar40 = (xmlDocPtr)0x0;
            do {
              iVar4 = (int)pxVar39;
              iVar2 = xmlMemBlocks();
              pxVar34 = gen_xmlDocPtr(uVar49,iVar4);
              pxVar32 = gen_xmlNodePtr(uVar56,iVar4);
              pxVar38 = gen_xmlDocPtr(uVar58,iVar4);
              pxVar39 = (xmlDocPtr)gen_xmlNodePtr(iVar1,iVar4);
              uVar55 = 0xffffffff;
              uVar52 = 0xffffffff;
              if (uVar57 < 4) {
                uVar52 = (&DAT_00157174)[uVar57];
              }
              uVar51 = (uint)pxVar40;
              if (uVar51 < 4) {
                uVar55 = *puVar46;
              }
              xmlDOMWrapCloneNode(0,pxVar34,pxVar32,0,pxVar38,pxVar39,uVar52,uVar55);
              call_tests = call_tests + 1;
              iVar4 = extraout_EDX_06;
              if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar34);
                iVar4 = extraout_EDX_07;
              }
              des_xmlNodePtr(uVar56,pxVar32,iVar4);
              iVar4 = extraout_EDX_08;
              if (((pxVar38 != (xmlDocPtr)0x0) && (api_doc != pxVar38)) && (pxVar38->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar38);
                iVar4 = extraout_EDX_09;
              }
              des_xmlNodePtr(iVar1,(xmlNodePtr)pxVar39,iVar4);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDOMWrapCloneNode",(ulong)(uint)(iVar4 - iVar2)
                      );
                test_ret_18 = test_ret_18 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar49);
                printf(" %d",(ulong)uVar56);
                printf(" %d",0);
                printf(" %d",(ulong)uVar58);
                printf(" %d",iVar1);
                printf(" %d",(ulong)uVar57);
                printf(" %d");
                putchar(10);
                pxVar39 = pxVar40;
              }
              uVar51 = uVar51 + 1;
              pxVar40 = (xmlDocPtr)(ulong)uVar51;
              puVar46 = puVar46 + 1;
            } while (uVar51 != 4);
            uVar57 = uVar57 + 1;
          } while (uVar57 != 4);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 3);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 4);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    uVar56 = 0;
    do {
      iVar2 = (int)pxVar39;
      iVar1 = xmlMemBlocks();
      pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar2);
      uVar52 = 0xffffffff;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      xmlDOMWrapReconcileNamespaces(0,pxVar39,uVar52);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,nr_08);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDOMWrapReconcileNamespaces",
               (ulong)(uint)(iVar2 - iVar1));
        test_ret_2 = test_ret_2 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar49);
        pxVar39 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      pxVar40 = (xmlDocPtr)0x0;
      puVar46 = &DAT_00157174;
      do {
        iVar4 = (int)pxVar39;
        iVar2 = xmlMemBlocks();
        pxVar34 = gen_xmlDocPtr(uVar49,iVar4);
        pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar56,iVar4);
        uVar52 = 0xffffffff;
        uVar58 = (uint)pxVar40;
        if (uVar58 < 4) {
          uVar52 = *puVar46;
        }
        xmlDOMWrapRemoveNode(0,pxVar34,pxVar39,uVar52);
        call_tests = call_tests + 1;
        iVar4 = extraout_EDX_10;
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc(pxVar34);
          iVar4 = extraout_EDX_11;
        }
        des_xmlNodePtr(uVar56,(xmlNodePtr)pxVar39,iVar4);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar2 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDOMWrapRemoveNode",(ulong)(uint)(iVar4 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          printf(" %d");
          putchar(10);
          pxVar39 = pxVar40;
        }
        uVar58 = uVar58 + 1;
        pxVar40 = (xmlDocPtr)(ulong)uVar58;
        puVar46 = puVar46 + 1;
      } while (uVar58 != 4);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      pxVar40 = (xmlDocPtr)0x0;
      puVar46 = &DAT_00157174;
      do {
        iVar5 = (int)pxVar39;
        iVar4 = xmlMemBlocks();
        pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar5);
        pxVar34 = gen_xmlDocPtr(uVar56,iVar5);
        uVar52 = 0xffffffff;
        uVar58 = (uint)pxVar40;
        if (uVar58 < 4) {
          uVar52 = *puVar46;
        }
        pxVar32 = (xmlNodePtr)xmlDocCopyNode(pxVar39,pxVar34,uVar52);
        desret_xmlNodePtr(pxVar32);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,nr_09);
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc(pxVar34);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocCopyNode",(ulong)(uint)(iVar5 - iVar4));
          iVar2 = iVar2 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          printf(" %d");
          putchar(10);
          pxVar39 = pxVar40;
        }
        uVar58 = uVar58 + 1;
        pxVar40 = (xmlDocPtr)(ulong)uVar58;
        puVar46 = puVar46 + 1;
      } while (uVar58 != 4);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar19 = iVar19 + test_ret_17 + iVar3 + test_ret_18 + test_ret_2;
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar49 = 0;
  do {
    pxVar40 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar39;
      iVar5 = xmlMemBlocks();
      pxVar34 = gen_xmlDocPtr(uVar49,iVar4);
      iVar6 = (int)pxVar40;
      pxVar39 = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar4);
      pxVar32 = (xmlNodePtr)xmlDocCopyNodeList(pxVar34,pxVar39);
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      iVar4 = extraout_EDX_12;
      if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
        xmlFreeDoc(pxVar34);
        iVar4 = extraout_EDX_13;
      }
      des_xmlNodePtr(iVar6,(xmlNodePtr)pxVar39,iVar4);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocCopyNodeList",(ulong)(uint)(iVar4 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar39 = pxVar40;
      }
      pxVar40 = (xmlDocPtr)(ulong)(iVar6 + 1U);
    } while (iVar6 + 1U != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar6 = (int)pxVar39;
      iVar5 = xmlMemBlocks();
      if (uVar49 == 0) {
        iVar6 = 0x14bacc;
        pFVar42 = fopen64("test.out","a+");
      }
      else {
        pFVar42 = (FILE *)0x0;
      }
      pxVar40 = gen_xmlDocPtr(uVar56,iVar6);
      pxVar39 = pxVar40;
      xmlDocDump(pFVar42);
      call_tests = call_tests + 1;
      if (pFVar42 != (FILE *)0x0) {
        fclose(pFVar42);
      }
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDump",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar39 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 4);
    bVar64 = uVar49 == 0;
    uVar49 = uVar49 + 1;
  } while (bVar64);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar49 = 0;
  do {
    uVar41 = 0;
    do {
      uVar56 = 0;
      iVar5 = (int)uVar41;
      uVar37 = 0;
      if (iVar5 == 0) {
        uVar37 = 0x15c408;
      }
      puVar46 = &DAT_00157174;
      do {
        iVar7 = (int)pxVar39;
        iVar6 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar49,iVar7);
        uVar52 = 0xffffffff;
        if (uVar56 < 4) {
          uVar52 = *puVar46;
        }
        pxVar39 = (xmlDocPtr)0x0;
        xmlDocDumpFormatMemory(pxVar40,0,uVar37,uVar52);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpFormatMemory",(ulong)(uint)(iVar7 - iVar6));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",0);
          printf(" %d",uVar41);
          pxVar39 = (xmlDocPtr)(ulong)uVar56;
          printf(" %d");
          putchar(10);
        }
        uVar56 = uVar56 + 1;
        puVar46 = puVar46 + 1;
      } while (uVar56 != 4);
      uVar41 = (ulong)(iVar5 + 1);
    } while (iVar5 == 0);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar49 = 0;
  do {
    uVar41 = 0;
    do {
      uVar56 = 0;
      iVar6 = (int)uVar41;
      uVar37 = 0;
      if (iVar6 == 0) {
        uVar37 = 0x15c408;
      }
      do {
        puVar46 = &DAT_00157174;
        pxVar40 = (xmlDocPtr)0x0;
        do {
          iVar8 = (int)pxVar39;
          iVar7 = xmlMemBlocks();
          pxVar34 = gen_xmlDocPtr(uVar49,iVar8);
          if (uVar56 < 3) {
            uVar54 = (&DAT_00159d48)[uVar56];
          }
          else {
            uVar54 = 0;
          }
          uVar52 = 0xffffffff;
          uVar58 = (uint)pxVar40;
          if (uVar58 < 4) {
            uVar52 = *puVar46;
          }
          pxVar39 = (xmlDocPtr)0x0;
          xmlDocDumpFormatMemoryEnc(pxVar34,0,uVar37,uVar54,uVar52);
          call_tests = call_tests + 1;
          if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
            xmlFreeDoc(pxVar34);
          }
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar7 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDocDumpFormatMemoryEnc",
                   (ulong)(uint)(iVar8 - iVar7));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",0);
            printf(" %d",uVar41);
            printf(" %d",(ulong)uVar56);
            printf(" %d");
            putchar(10);
            pxVar39 = pxVar40;
          }
          uVar58 = uVar58 + 1;
          pxVar40 = (xmlDocPtr)(ulong)uVar58;
          puVar46 = puVar46 + 1;
        } while (uVar58 != 4);
        uVar56 = uVar56 + 1;
      } while (uVar56 != 4);
      uVar41 = (ulong)(iVar6 + 1);
    } while (iVar6 == 0);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar8 = (int)pxVar39;
      iVar7 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar49,iVar8);
      uVar37 = 0;
      if (uVar56 == 0) {
        uVar37 = 0x15c408;
      }
      pxVar39 = (xmlDocPtr)0x0;
      xmlDocDumpMemory(pxVar40,0,uVar37);
      call_tests = call_tests + 1;
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDumpMemory",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d",0);
        pxVar39 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 == 1);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  iVar19 = iVar19 + iVar1 + iVar2 + iVar3 + iVar4 + test_ret_2;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar49 = 0;
  do {
    uVar41 = 0;
    do {
      pxVar40 = (xmlDocPtr)0x0;
      iVar2 = (int)uVar41;
      uVar37 = 0;
      if (iVar2 == 0) {
        uVar37 = 0x15c408;
      }
      puVar62 = &DAT_00159d48;
      do {
        iVar4 = (int)pxVar39;
        iVar3 = xmlMemBlocks();
        pxVar34 = gen_xmlDocPtr(uVar49,iVar4);
        uVar56 = (uint)pxVar40;
        if (uVar56 < 3) {
          uVar54 = *puVar62;
        }
        else {
          uVar54 = 0;
        }
        pxVar39 = (xmlDocPtr)0x0;
        xmlDocDumpMemoryEnc(pxVar34,0,uVar37,uVar54);
        call_tests = call_tests + 1;
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc(pxVar34);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpMemoryEnc",(ulong)(uint)(iVar4 - iVar3));
          iVar1 = iVar1 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",0);
          printf(" %d",uVar41);
          printf(" %d");
          putchar(10);
          pxVar39 = pxVar40;
        }
        uVar56 = uVar56 + 1;
        pxVar40 = (xmlDocPtr)(ulong)uVar56;
        puVar62 = puVar62 + 1;
      } while (uVar56 != 4);
      uVar41 = (ulong)(iVar2 + 1);
    } while (iVar2 == 0);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  _test_ret_1 = 0;
  do {
    uVar49 = 0;
    do {
      pxVar40 = (xmlDocPtr)0x0;
      puVar46 = &DAT_00157174;
      do {
        iVar4 = (int)pxVar39;
        iVar3 = xmlMemBlocks();
        if (test_ret_1 == 0) {
          iVar4 = 0x14bacc;
          pFVar42 = fopen64("test.out","a+");
        }
        else {
          pFVar42 = (FILE *)0x0;
        }
        pxVar34 = gen_xmlDocPtr(uVar49,iVar4);
        uVar52 = 0xffffffff;
        uVar56 = (uint)pxVar40;
        if (uVar56 < 4) {
          uVar52 = *puVar46;
        }
        pxVar39 = pxVar34;
        xmlDocFormatDump(pFVar42,pxVar34,uVar52);
        call_tests = call_tests + 1;
        if (pFVar42 != (FILE *)0x0) {
          fclose(pFVar42);
        }
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc(pxVar34);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocFormatDump",(ulong)(uint)(iVar4 - iVar3));
          iVar2 = iVar2 + 1;
          printf(" %d",_test_ret_1);
          printf(" %d",(ulong)uVar49);
          printf(" %d");
          putchar(10);
          pxVar39 = pxVar40;
        }
        uVar56 = uVar56 + 1;
        pxVar40 = (xmlDocPtr)(ulong)uVar56;
        puVar46 = puVar46 + 1;
      } while (uVar56 != 4);
      uVar49 = uVar49 + 1;
    } while (uVar49 != 4);
    bVar64 = test_ret_1 == 0;
    _test_ret_1 = (ulong)(test_ret_1 + 1);
  } while (bVar64);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  pxVar32 = (xmlNodePtr)xmlDocGetRootElement(0);
  desret_xmlNodePtr(pxVar32);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDocGetRootElement");
    pxVar39 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar7 = 0;
  do {
    uVar56 = 0;
    do {
      iVar9 = (int)pxVar39;
      iVar8 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar49,iVar9);
      if (uVar56 == 0) {
        pxVar34 = (xmlDocPtr)xmlNewPI("test",0);
      }
      else {
        pxVar34 = (xmlDocPtr)0x0;
      }
      pxVar39 = pxVar34;
      pxVar32 = (xmlNodePtr)xmlDocSetRootElement(pxVar40);
      if (pxVar40 == (xmlDocPtr)0x0) {
        xmlFreeNode(pxVar34);
        desret_xmlNodePtr(pxVar32);
        call_tests = call_tests + 1;
      }
      else {
        desret_xmlNodePtr(pxVar32);
        call_tests = call_tests + 1;
        if ((api_doc != pxVar40) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocSetRootElement",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar39 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  _test_ret_1 = 0;
  do {
    uVar49 = 0;
    do {
      pxVar40 = (xmlDocPtr)0x0;
      do {
        iVar10 = (int)pxVar39;
        iVar9 = xmlMemBlocks();
        if (test_ret_1 == 0) {
          iVar10 = 0x14bacc;
          pFVar42 = fopen64("test.out","a+");
        }
        else {
          pFVar42 = (FILE *)0x0;
        }
        pxVar34 = gen_xmlDocPtr(uVar49,iVar10);
        iVar11 = (int)pxVar40;
        pxVar39 = (xmlDocPtr)gen_xmlNodePtr(iVar11,iVar10);
        xmlElemDump(pFVar42,pxVar34,pxVar39);
        call_tests = call_tests + 1;
        iVar10 = extraout_EDX_14;
        if (pFVar42 != (FILE *)0x0) {
          fclose(pFVar42);
          iVar10 = extraout_EDX_15;
        }
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc(pxVar34);
          iVar10 = extraout_EDX_16;
        }
        des_xmlNodePtr(iVar11,(xmlNodePtr)pxVar39,iVar10);
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlElemDump",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",_test_ret_1);
          printf(" %d",(ulong)uVar49);
          printf(" %d");
          putchar(10);
          pxVar39 = pxVar40;
        }
        pxVar40 = (xmlDocPtr)(ulong)(iVar11 + 1U);
      } while (iVar11 + 1U != 3);
      uVar49 = uVar49 + 1;
    } while (uVar49 != 4);
    bVar64 = test_ret_1 == 0;
    _test_ret_1 = (ulong)(test_ret_1 + 1);
  } while (bVar64);
  test_ret_2 = (int)(iVar3 != iVar4);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar3 = 0;
  do {
    iVar9 = (int)pxVar39;
    iVar4 = xmlMemBlocks();
    pxVar39 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar9);
    pxVar32 = (xmlNodePtr)xmlFirstElementChild(pxVar39);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar39,nr_10);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar4 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFirstElementChild",(ulong)(uint)(iVar9 - iVar4));
      iVar3 = iVar3 + 1;
      pxVar39 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlGetBufferAllocationScheme();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar4 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetBufferAllocationScheme");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  xmlGetCompressMode();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetCompressMode");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar20 = xmlMemBlocks();
  xmlGetDocCompressMode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar50 = xmlMemBlocks();
  if (iVar20 != iVar50) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetDocCompressMode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  pxVar32 = (xmlNodePtr)xmlGetIntSubset(0);
  desret_xmlNodePtr(pxVar32);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar14 = xmlMemBlocks();
  if (iVar12 != iVar14) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetIntSubset");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar13 = xmlMemBlocks();
  pxVar32 = (xmlNodePtr)xmlGetLastChild(0);
  desret_xmlNodePtr(pxVar32);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar13 != iVar15) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLastChild");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  xmlGetLineNo(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar17 = xmlMemBlocks();
  if (iVar16 != iVar17) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLineNo");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar18 = 0;
  iVar59 = 0;
  do {
    iVar21 = xmlMemBlocks();
    lVar36 = xmlGetNoNsProp(0);
    if (lVar36 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetNoNsProp",(ulong)(uint)(iVar22 - iVar21));
      iVar59 = iVar59 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 5);
  function_tests = function_tests + 1;
  iVar18 = xmlMemBlocks();
  lVar36 = xmlGetNodePath(0);
  if (lVar36 != 0) {
    (*_xmlFree)(lVar36);
  }
  test_ret_1 = (int)(iVar16 != iVar17);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar18 != iVar16) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetNodePath");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    uVar56 = 0;
    do {
      iVar21 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      if (uVar56 < 4) {
        uVar54 = *puVar62;
      }
      else {
        uVar54 = 0;
      }
      lVar36 = xmlGetNsProp(0,uVar37,uVar54);
      if (lVar36 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar22 = xmlMemBlocks();
      if (iVar21 != iVar22) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetNsProp",(ulong)(uint)(iVar22 - iVar21));
        iVar17 = iVar17 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar22 = 0;
  iVar21 = 0;
  do {
    iVar23 = xmlMemBlocks();
    lVar36 = xmlGetProp(0);
    if (lVar36 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetProp",(ulong)(uint)(iVar24 - iVar23));
      iVar21 = iVar21 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 5);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    uVar56 = 0;
    do {
      iVar22 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      if (uVar56 < 4) {
        uVar54 = *puVar62;
      }
      else {
        uVar54 = 0;
      }
      lVar36 = xmlHasNsProp(0,uVar37,uVar54);
      if (lVar36 != 0) {
        xmlUnlinkNode(lVar36);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      if (iVar22 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHasNsProp",(ulong)(uint)(iVar23 - iVar22));
        test_ret = test_ret + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar22 = 0;
  iVar23 = 0;
  do {
    iVar24 = xmlMemBlocks();
    lVar36 = xmlHasProp(0);
    if (lVar36 != 0) {
      xmlUnlinkNode(lVar36);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar25 = xmlMemBlocks();
    if (iVar24 != iVar25) {
      iVar25 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHasProp",(ulong)(uint)(iVar25 - iVar24));
      iVar23 = iVar23 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 5);
  function_tests = function_tests + 1;
  iVar22 = xmlMemBlocks();
  xmlIsBlankNode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar24 = xmlMemBlocks();
  if (iVar22 != iVar24) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlIsBlankNode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar25 = 0;
  uVar49 = 0;
  do {
    pxVar32 = (xmlNodePtr)0x0;
    puVar62 = &DAT_00159d60;
    do {
      iVar26 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      uVar56 = (uint)pxVar32;
      if (uVar56 < 4) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      xmlIsXHTML(uVar37);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar27 = xmlMemBlocks();
      if (iVar26 != iVar27) {
        iVar27 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsXHTML",(ulong)(uint)(iVar27 - iVar26));
        iVar25 = iVar25 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pcVar53 = (char *)pxVar32;
      }
      uVar56 = uVar56 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar26 = 0;
  do {
    iVar28 = (int)pcVar53;
    iVar27 = xmlMemBlocks();
    pcVar53 = (char *)gen_xmlNodePtr(uVar49,iVar28);
    pxVar32 = (xmlNodePtr)xmlLastElementChild(pcVar53);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar49,(xmlNodePtr)pcVar53,nr_11);
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLastElementChild",(ulong)(uint)(iVar28 - iVar27));
      iVar26 = iVar26 + 1;
      pcVar53 = (char *)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar49 = 0;
  do {
    iVar28 = 0;
    do {
      pxVar32 = (xmlNodePtr)0x0;
      piVar63 = &DAT_00157174;
      do {
        iVar31 = (int)pcVar53;
        iVar29 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar49,iVar31);
        switch(iVar28) {
        case 0:
          bVar64 = false;
          pcVar53 = "foo";
          break;
        case 1:
          bVar64 = false;
          pcVar53 = "<foo/>";
          break;
        case 2:
          bVar64 = false;
          pcVar53 = anon_var_dwarf_197;
          break;
        case 3:
          bVar64 = false;
          pcVar53 = " 2ab ";
          break;
        default:
          bVar64 = true;
          pcVar53 = (char *)0x0;
        }
        iVar31 = -1;
        uVar56 = (uint)pxVar32;
        if (uVar56 < 4) {
          iVar31 = *piVar63;
        }
        if ((!bVar64) && (iVar30 = xmlStrlen(pcVar53), iVar30 < iVar31)) {
          iVar31 = 0;
        }
        pxVar43 = (xmlNodePtr)xmlNewCDataBlock(pxVar40,pcVar53,iVar31);
        desret_xmlNodePtr(pxVar43);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar31 = xmlMemBlocks();
        if (iVar29 != iVar31) {
          iVar31 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewCDataBlock",(ulong)(uint)(iVar31 - iVar29));
          iVar27 = iVar27 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",iVar28);
          printf(" %d");
          putchar(10);
          pcVar53 = (char *)pxVar32;
        }
        uVar56 = uVar56 + 1;
        pxVar32 = (xmlNodePtr)(ulong)uVar56;
        piVar63 = piVar63 + 1;
      } while (uVar56 != 4);
      iVar28 = iVar28 + 1;
    } while (iVar28 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar32 = (xmlNodePtr)0x0;
    do {
      iVar29 = (int)pcVar53;
      iVar28 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar49,iVar29);
      uVar56 = (uint)pxVar32;
      if (uVar56 < 4) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      pxVar43 = (xmlNodePtr)xmlNewCharRef(pxVar40);
      desret_xmlNodePtr(pxVar43);
      call_tests = call_tests + 1;
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar29 = xmlMemBlocks();
      if (iVar28 != iVar29) {
        iVar29 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewCharRef",(ulong)(uint)(iVar29 - iVar28));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pcVar53 = (char *)pxVar32;
      }
      uVar56 = uVar56 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar28 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar41 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar32 = (xmlNodePtr)0x0;
        do {
          iVar31 = (int)pcVar53;
          iVar29 = xmlMemBlocks();
          pcVar53 = (char *)gen_xmlNodePtr(uVar49,iVar31);
          if (uVar56 == 0) {
            get_api_root();
            pxVar47 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar47 = api_root->nsDef;
              api_ns = pxVar47;
            }
          }
          else {
            pxVar47 = (xmlNs *)0x0;
          }
          if ((uint)uVar41 < 4) {
            uVar37 = (&DAT_00159d60)[uVar41];
          }
          else {
            uVar37 = 0;
          }
          uVar58 = (uint)pxVar32;
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          pxVar43 = (xmlNodePtr)xmlNewChild(pcVar53,pxVar47,uVar37,uVar54);
          desret_xmlNodePtr(pxVar43);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar49,(xmlNodePtr)pcVar53,nr_12);
          if (uVar56 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar31 = xmlMemBlocks();
          if (iVar29 != iVar31) {
            iVar31 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewChild",(ulong)(uint)(iVar31 - iVar29));
            iVar28 = iVar28 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",uVar41);
            printf(" %d");
            putchar(10);
            pcVar53 = (char *)pxVar32;
          }
          uVar58 = uVar58 + 1;
          pxVar32 = (xmlNodePtr)(ulong)uVar58;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        uVar58 = (uint)uVar41 + 1;
        uVar41 = (ulong)uVar58;
      } while (uVar58 != 5);
      bVar64 = uVar56 == 0;
      uVar56 = uVar56 + 1;
    } while (bVar64);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  puVar62 = &DAT_00159d60;
  uVar49 = 0;
  iVar29 = 0;
  do {
    iVar31 = xmlMemBlocks();
    if (uVar49 < 4) {
      uVar37 = *puVar62;
    }
    else {
      uVar37 = 0;
    }
    pxVar32 = (xmlNodePtr)xmlNewComment(uVar37);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar31 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewComment",(ulong)(uint)(iVar30 - iVar31));
      iVar29 = iVar29 + 1;
      pcVar53 = (char *)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar62 = puVar62 + 1;
  } while (uVar49 != 5);
  iVar1 = iVar19 + iVar5 + iVar6 + iVar1 + iVar2 + test_ret_2 + iVar7 + iVar8 + iVar3 +
          (uint)(iVar4 != iVar9) + (uint)(iVar10 != iVar11) + (uint)(iVar20 != iVar50) +
          (uint)(iVar12 != iVar14) + (uint)(iVar13 != iVar15) + test_ret_1 + iVar59 +
          (uint)(iVar18 != iVar16) + iVar17 + iVar21 + test_ret + iVar23 + (uint)(iVar22 != iVar24)
          + iVar25 + iVar26 + iVar27 + test_ret_4;
  function_tests = function_tests + 1;
  puVar62 = &DAT_00159d60;
  uVar49 = 0;
  iVar19 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar49 < 4) {
      uVar37 = *puVar62;
    }
    else {
      uVar37 = 0;
    }
    pxVar40 = (xmlDocPtr)xmlNewDoc(uVar37);
    if (api_doc != pxVar40) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDoc",(ulong)(uint)(iVar3 - iVar2));
      iVar19 = iVar19 + 1;
      pcVar53 = (char *)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar62 = puVar62 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar32 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)pcVar53;
      iVar3 = xmlMemBlocks();
      pxVar40 = gen_xmlDocPtr(uVar49,iVar4);
      uVar56 = (uint)pxVar32;
      if (uVar56 < 4) {
        pcVar53 = (char *)*puVar62;
      }
      else {
        pcVar53 = (char *)0x0;
      }
      pxVar43 = (xmlNodePtr)xmlNewDocComment(pxVar40);
      desret_xmlNodePtr(pxVar43);
      call_tests = call_tests + 1;
      if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
        xmlFreeDoc(pxVar40);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewDocComment",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pcVar53 = (char *)pxVar32;
      }
      uVar56 = uVar56 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar40 = gen_xmlDocPtr(uVar49,(int)pcVar53);
    pxVar32 = (xmlNodePtr)xmlNewDocFragment(pxVar40);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
      xmlFreeDoc(pxVar40);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocFragment",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      pcVar53 = (char *)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar41 = 0;
      do {
        puVar62 = &DAT_00159d60;
        uVar58 = 0;
        do {
          iVar5 = (int)pcVar53;
          iVar4 = xmlMemBlocks();
          pxVar40 = gen_xmlDocPtr(uVar49,iVar5);
          if (uVar56 == 0) {
            get_api_root();
            pcVar53 = (char *)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pcVar53 = (char *)api_root->nsDef;
              api_ns = (xmlNsPtr)pcVar53;
            }
          }
          else {
            pcVar53 = (char *)(xmlNodePtr)0x0;
          }
          if ((uint)uVar41 < 4) {
            uVar37 = (&DAT_00159d60)[uVar41];
          }
          else {
            uVar37 = 0;
          }
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          pxVar32 = (xmlNodePtr)xmlNewDocNode(pxVar40,pcVar53,uVar37,uVar54);
          desret_xmlNodePtr(pxVar32);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          if (uVar56 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNode",(ulong)(uint)(iVar5 - iVar4));
            test_ret_4 = test_ret_4 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",uVar41);
            pcVar53 = (char *)(ulong)uVar58;
            printf(" %d");
            putchar(10);
          }
          uVar58 = uVar58 + 1;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        uVar58 = (uint)uVar41 + 1;
        uVar41 = (ulong)uVar58;
      } while (uVar58 != 5);
      bVar64 = uVar56 == 0;
      uVar56 = uVar56 + 1;
    } while (bVar64);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      _test_ret_1 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar32 = (xmlNodePtr)0x0;
        do {
          iVar6 = (int)pcVar53;
          iVar5 = xmlMemBlocks();
          pxVar40 = gen_xmlDocPtr(uVar49,iVar6);
          if (uVar56 == 0) {
            get_api_root();
            pcVar53 = (char *)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pcVar53 = (char *)api_root->nsDef;
              api_ns = (xmlNsPtr)pcVar53;
            }
          }
          else {
            pcVar53 = (char *)(xmlNodePtr)0x0;
          }
          if (test_ret_1 == 0) {
            uVar37 = xmlStrdup("eaten");
          }
          else {
            uVar37 = 0;
          }
          uVar58 = (uint)pxVar32;
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          pxVar43 = (xmlNodePtr)xmlNewDocNodeEatName(pxVar40,pcVar53,uVar37,uVar54);
          desret_xmlNodePtr(pxVar43);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          if (uVar56 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNodeEatName",(ulong)(uint)(iVar6 - iVar5));
            iVar4 = iVar4 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",_test_ret_1);
            printf(" %d");
            putchar(10);
            pcVar53 = (char *)pxVar32;
          }
          uVar58 = uVar58 + 1;
          pxVar32 = (xmlNodePtr)(ulong)uVar58;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        bVar64 = test_ret_1 == 0;
        _test_ret_1 = (ulong)(test_ret_1 + 1);
      } while (bVar64);
      bVar64 = uVar56 == 0;
      uVar56 = uVar56 + 1;
    } while (bVar64);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      puVar62 = &DAT_00159d60;
      do {
        iVar7 = (int)pcVar53;
        iVar6 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar49,iVar7);
        if (uVar56 < 4) {
          pcVar53 = (char *)(&DAT_00159d60)[uVar56];
        }
        else {
          pcVar53 = (char *)0x0;
        }
        if (uVar58 < 4) {
          uVar37 = *puVar62;
        }
        else {
          uVar37 = 0;
        }
        pxVar32 = (xmlNodePtr)xmlNewDocPI(pxVar40,pcVar53,uVar37);
        desret_xmlNodePtr(pxVar32);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocPI",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          pcVar53 = (char *)(ulong)uVar58;
          printf(" %d");
          putchar(10);
        }
        uVar58 = uVar58 + 1;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  iVar19 = iVar1 + iVar28 + iVar29 + iVar19 + iVar2 + iVar3 + test_ret_4;
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      puVar62 = &DAT_00159d60;
      do {
        iVar2 = (int)pcVar53;
        iVar1 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar49,iVar2);
        if (uVar56 < 4) {
          pcVar53 = (char *)(&DAT_00159d60)[uVar56];
        }
        else {
          pcVar53 = (char *)0x0;
        }
        if (uVar58 < 4) {
          uVar37 = *puVar62;
        }
        else {
          uVar37 = 0;
        }
        lVar36 = xmlNewDocProp(pxVar40,pcVar53,uVar37);
        if (lVar36 != 0) {
          xmlUnlinkNode(lVar36);
          xmlFreeNode(lVar36);
        }
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocProp",(ulong)(uint)(iVar2 - iVar1));
          test_ret_4 = test_ret_4 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          pcVar53 = (char *)(ulong)uVar58;
          printf(" %d");
          putchar(10);
        }
        uVar58 = uVar58 + 1;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar32 = (xmlNodePtr)0x0;
        do {
          iVar2 = (int)pcVar53;
          iVar1 = xmlMemBlocks();
          pxVar40 = gen_xmlDocPtr(uVar49,iVar2);
          if (uVar56 == 0) {
            get_api_root();
            pcVar53 = (char *)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pcVar53 = (char *)api_root->nsDef;
              api_ns = (xmlNsPtr)pcVar53;
            }
          }
          else {
            pcVar53 = (char *)(xmlNodePtr)0x0;
          }
          if (uVar58 < 4) {
            uVar37 = (&DAT_00159d60)[uVar58];
          }
          else {
            uVar37 = 0;
          }
          uVar57 = (uint)pxVar32;
          if (uVar57 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          pxVar43 = (xmlNodePtr)xmlNewDocRawNode(pxVar40,pcVar53,uVar37,uVar54);
          desret_xmlNodePtr(pxVar43);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          if (uVar56 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocRawNode",(ulong)(uint)(iVar2 - iVar1));
            test_ret = test_ret + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",(ulong)uVar58);
            printf(" %d");
            putchar(10);
            pcVar53 = (char *)pxVar32;
          }
          uVar57 = uVar57 + 1;
          pxVar32 = (xmlNodePtr)(ulong)uVar57;
          puVar62 = puVar62 + 1;
        } while (uVar57 != 5);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 5);
      bVar64 = uVar56 == 0;
      uVar56 = uVar56 + 1;
    } while (bVar64);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  puVar62 = &DAT_00159d60;
  uVar49 = 0;
  iVar1 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar49 < 4) {
      pcVar53 = (char *)*puVar62;
    }
    else {
      pcVar53 = (char *)0x0;
    }
    pxVar32 = (xmlNodePtr)xmlNewDocText(0);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocText",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      printf(" %d",0);
      pcVar53 = (char *)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar62 = puVar62 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar49 = 0;
  do {
    iVar3 = 0;
    do {
      pcVar61 = (char *)0x0;
      piVar63 = &DAT_00157174;
      do {
        iVar7 = (int)pcVar53;
        iVar6 = xmlMemBlocks();
        pxVar40 = gen_xmlDocPtr(uVar49,iVar7);
        switch(iVar3) {
        case 0:
          bVar64 = false;
          pcVar53 = "foo";
          break;
        case 1:
          bVar64 = false;
          pcVar53 = "<foo/>";
          break;
        case 2:
          bVar64 = false;
          pcVar53 = anon_var_dwarf_197;
          break;
        case 3:
          bVar64 = false;
          pcVar53 = " 2ab ";
          break;
        default:
          bVar64 = true;
          pcVar53 = (char *)0x0;
        }
        iVar7 = -1;
        uVar56 = (uint)pcVar61;
        if (uVar56 < 4) {
          iVar7 = *piVar63;
        }
        if ((!bVar64) && (iVar8 = xmlStrlen(pcVar53), iVar8 < iVar7)) {
          iVar7 = 0;
        }
        pxVar32 = (xmlNodePtr)xmlNewDocTextLen(pxVar40,pcVar53,iVar7);
        desret_xmlNodePtr(pxVar32);
        call_tests = call_tests + 1;
        if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
          xmlFreeDoc(pxVar40);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocTextLen",(ulong)(uint)(iVar7 - iVar6));
          iVar2 = iVar2 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",iVar3);
          printf(" %d");
          putchar(10);
          pcVar53 = pcVar61;
        }
        uVar56 = uVar56 + 1;
        pcVar61 = (char *)(ulong)uVar56;
        piVar63 = piVar63 + 1;
      } while (uVar56 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  iVar19 = iVar19 + iVar4 + iVar5 + test_ret_4 + test_ret;
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar41 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pcVar61 = (char *)0x0;
        do {
          iVar4 = (int)pcVar53;
          iVar3 = xmlMemBlocks();
          pxVar40 = gen_xmlDocPtr(uVar49,iVar4);
          if (uVar56 < 4) {
            pcVar53 = (char *)(&DAT_00159d60)[uVar56];
          }
          else {
            pcVar53 = (char *)0x0;
          }
          if ((uint)uVar41 < 4) {
            uVar37 = (&DAT_00159d60)[uVar41];
          }
          else {
            uVar37 = 0;
          }
          uVar58 = (uint)pcVar61;
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          pxVar32 = (xmlNodePtr)xmlNewDtd(pxVar40,pcVar53,uVar37,uVar54);
          desret_xmlNodePtr(pxVar32);
          call_tests = call_tests + 1;
          if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)) {
            xmlFreeDoc(pxVar40);
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDtd",(ulong)(uint)(iVar4 - iVar3));
            test_ret = test_ret + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",uVar41);
            printf(" %d");
            putchar(10);
            pcVar53 = pcVar61;
          }
          uVar58 = uVar58 + 1;
          pcVar61 = (char *)(ulong)uVar58;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        uVar58 = (uint)uVar41 + 1;
        uVar41 = (ulong)uVar58;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar49 = 0;
  do {
    iVar4 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar49 == 0) {
        get_api_root();
        pxVar47 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          pxVar47 = api_root->nsDef;
          api_ns = pxVar47;
        }
      }
      else {
        pxVar47 = (xmlNs *)0x0;
      }
      pxVar32 = (xmlNodePtr)xmlNewNode(pxVar47);
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      if (uVar49 == 0) {
        xmlFreeDoc();
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNode",(ulong)(uint)(iVar6 - iVar5));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 5);
    bVar64 = uVar49 == 0;
    uVar49 = uVar49 + 1;
  } while (bVar64);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar49 == 0) {
        get_api_root();
        pxVar47 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          pxVar47 = api_root->nsDef;
          api_ns = pxVar47;
        }
      }
      else {
        pxVar47 = (xmlNs *)0x0;
      }
      if (uVar56 == 0) {
        pxVar32 = (xmlNodePtr)xmlStrdup("eaten");
      }
      else {
        pxVar32 = (xmlNodePtr)0x0;
      }
      pxVar43 = (xmlNodePtr)xmlNewNodeEatName(pxVar47);
      desret_xmlNodePtr(pxVar43);
      call_tests = call_tests + 1;
      if (uVar49 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNodeEatName",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar32 = (xmlNodePtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 == 1);
    bVar64 = uVar49 == 0;
    uVar49 = uVar49 + 1;
  } while (bVar64);
  iVar19 = iVar19 + iVar1 + iVar2 + test_ret;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      puVar62 = &DAT_00159d60;
      do {
        iVar5 = (int)pxVar32;
        iVar2 = xmlMemBlocks();
        pxVar32 = gen_xmlNodePtr(uVar49,iVar5);
        if (uVar56 < 4) {
          uVar37 = (&DAT_00159d60)[uVar56];
        }
        else {
          uVar37 = 0;
        }
        if (uVar58 < 4) {
          uVar54 = *puVar62;
        }
        else {
          uVar54 = 0;
        }
        auVar65 = xmlNewNs(pxVar32,uVar37,uVar54);
        iVar5 = auVar65._8_4_;
        if ((pxVar32 == (xmlNodePtr)0x0) && (auVar65._0_8_ != 0)) {
          xmlFreeNs(auVar65._0_8_);
          iVar5 = extraout_EDX_17;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar49,pxVar32,iVar5);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar2 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewNs",(ulong)(uint)(iVar5 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          pxVar32 = (xmlNodePtr)(ulong)uVar58;
          printf(" %d");
          putchar(10);
        }
        uVar58 = uVar58 + 1;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar5 = 0;
  do {
    uVar49 = 0;
    do {
      uVar56 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar43 = (xmlNodePtr)0x0;
        do {
          iVar7 = (int)pxVar32;
          iVar6 = xmlMemBlocks();
          pxVar32 = gen_xmlNodePtr(iVar5,iVar7);
          if (uVar49 == 0) {
            get_api_root();
            pxVar47 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar47 = api_root->nsDef;
              api_ns = pxVar47;
            }
          }
          else {
            pxVar47 = (xmlNs *)0x0;
          }
          if (uVar56 < 4) {
            uVar37 = (&DAT_00159d60)[uVar56];
          }
          else {
            uVar37 = 0;
          }
          uVar58 = (uint)pxVar43;
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          auVar65 = xmlNewNsProp(pxVar32,pxVar47,uVar37,uVar54);
          iVar7 = auVar65._8_4_;
          lVar36 = auVar65._0_8_;
          if (lVar36 != 0) {
            xmlUnlinkNode(lVar36);
            xmlFreeNode(lVar36);
            iVar7 = extraout_EDX_18;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar5,pxVar32,iVar7);
          if (uVar49 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsProp",(ulong)(uint)(iVar7 - iVar6));
            iVar2 = iVar2 + 1;
            printf(" %d",iVar5);
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d");
            putchar(10);
            pxVar32 = pxVar43;
          }
          uVar58 = uVar58 + 1;
          pxVar43 = (xmlNodePtr)(ulong)uVar58;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        uVar56 = uVar56 + 1;
      } while (uVar56 != 5);
      bVar64 = uVar49 == 0;
      uVar49 = uVar49 + 1;
    } while (bVar64);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  iVar6 = 0;
  do {
    uVar49 = 0;
    do {
      _test_ret_1 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar43 = (xmlNodePtr)0x0;
        do {
          iVar8 = (int)pxVar32;
          iVar7 = xmlMemBlocks();
          pxVar32 = gen_xmlNodePtr(iVar6,iVar8);
          if (uVar49 == 0) {
            get_api_root();
            pxVar47 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar47 = api_root->nsDef;
              api_ns = pxVar47;
            }
          }
          else {
            pxVar47 = (xmlNs *)0x0;
          }
          if (test_ret_1 == 0) {
            uVar37 = xmlStrdup("eaten");
          }
          else {
            uVar37 = 0;
          }
          uVar56 = (uint)pxVar43;
          if (uVar56 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          auVar65 = xmlNewNsPropEatName(pxVar32,pxVar47,uVar37,uVar54);
          iVar8 = auVar65._8_4_;
          lVar36 = auVar65._0_8_;
          if (lVar36 != 0) {
            xmlUnlinkNode(lVar36);
            xmlFreeNode(lVar36);
            iVar8 = extraout_EDX_19;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar6,pxVar32,iVar8);
          if (uVar49 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar7 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsPropEatName",(ulong)(uint)(iVar8 - iVar7));
            iVar5 = iVar5 + 1;
            printf(" %d",iVar6);
            printf(" %d",(ulong)uVar49);
            printf(" %d",_test_ret_1);
            printf(" %d");
            putchar(10);
            pxVar32 = pxVar43;
          }
          uVar56 = uVar56 + 1;
          pxVar43 = (xmlNodePtr)(ulong)uVar56;
          puVar62 = puVar62 + 1;
        } while (uVar56 != 5);
        bVar64 = test_ret_1 == 0;
        _test_ret_1 = (ulong)(test_ret_1 + 1);
      } while (bVar64);
      bVar64 = uVar49 == 0;
      uVar49 = uVar49 + 1;
    } while (bVar64);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar32 = (xmlNodePtr)0x0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      uVar56 = (uint)pxVar32;
      if (uVar56 < 4) {
        pxVar43 = (xmlNodePtr)*puVar62;
      }
      else {
        pxVar43 = (xmlNodePtr)0x0;
      }
      pxVar44 = (xmlNodePtr)xmlNewPI(uVar37);
      desret_xmlNodePtr(pxVar44);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewPI",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar43 = pxVar32;
      }
      uVar56 = uVar56 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      pxVar32 = (xmlNodePtr)0x0;
      puVar62 = &DAT_00159d60;
      do {
        iVar8 = (int)pxVar43;
        iVar7 = xmlMemBlocks();
        pxVar43 = gen_xmlNodePtr(uVar49,iVar8);
        if (uVar56 < 4) {
          uVar37 = (&DAT_00159d60)[uVar56];
        }
        else {
          uVar37 = 0;
        }
        uVar58 = (uint)pxVar32;
        if (uVar58 < 4) {
          uVar54 = *puVar62;
        }
        else {
          uVar54 = 0;
        }
        auVar65 = xmlNewProp(pxVar43,uVar37,uVar54);
        iVar8 = auVar65._8_4_;
        lVar36 = auVar65._0_8_;
        if (lVar36 != 0) {
          xmlUnlinkNode(lVar36);
          xmlFreeNode(lVar36);
          iVar8 = extraout_EDX_20;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar49,pxVar43,iVar8);
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewProp",(ulong)(uint)(iVar8 - iVar7));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          printf(" %d");
          putchar(10);
          pxVar43 = pxVar32;
        }
        uVar58 = uVar58 + 1;
        pxVar32 = (xmlNodePtr)(ulong)uVar58;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  puVar62 = &DAT_00159d60;
  uVar49 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar49 < 4) {
      pxVar32 = (xmlNodePtr)*puVar62;
    }
    else {
      pxVar32 = (xmlNodePtr)0x0;
    }
    pxVar43 = (xmlNodePtr)xmlNewReference(0);
    desret_xmlNodePtr(pxVar43);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewReference",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      pxVar32 = (xmlNodePtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar62 = puVar62 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  puVar62 = &DAT_00159d60;
  uVar49 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar49 < 4) {
      uVar37 = *puVar62;
    }
    else {
      uVar37 = 0;
    }
    pxVar43 = (xmlNodePtr)xmlNewText(uVar37);
    desret_xmlNodePtr(pxVar43);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewText",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar62 = puVar62 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar19 = iVar19 + iVar3 + iVar4 + iVar1 + iVar2 + iVar5 + iVar6 + test_ret;
  test_ret = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar41 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar43 = (xmlNodePtr)0x0;
        do {
          iVar2 = (int)pxVar32;
          iVar1 = xmlMemBlocks();
          pxVar32 = gen_xmlNodePtr(uVar49,iVar2);
          if (uVar56 == 0) {
            get_api_root();
            pxVar47 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar47 = api_root->nsDef;
              api_ns = pxVar47;
            }
          }
          else {
            pxVar47 = (xmlNs *)0x0;
          }
          if ((uint)uVar41 < 4) {
            uVar37 = (&DAT_00159d60)[uVar41];
          }
          else {
            uVar37 = 0;
          }
          uVar58 = (uint)pxVar43;
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          pxVar44 = (xmlNodePtr)xmlNewTextChild(pxVar32,pxVar47,uVar37,uVar54);
          desret_xmlNodePtr(pxVar44);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar49,pxVar32,nr_13);
          if (uVar56 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewTextChild",(ulong)(uint)(iVar2 - iVar1));
            test_ret = test_ret + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",uVar41);
            printf(" %d");
            putchar(10);
            pxVar32 = pxVar43;
          }
          uVar58 = uVar58 + 1;
          pxVar43 = (xmlNodePtr)(ulong)uVar58;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        uVar58 = (uint)uVar41 + 1;
        uVar41 = (ulong)uVar58;
      } while (uVar58 != 5);
      bVar64 = uVar56 == 0;
      uVar56 = uVar56 + 1;
    } while (bVar64);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  uVar41 = 0;
  iVar1 = 0;
  do {
    puVar60 = &DAT_00157174;
    uVar49 = 0;
    do {
      iVar2 = xmlMemBlocks();
      switch(uVar41) {
      case 0:
        bVar64 = false;
        pcVar53 = "foo";
        break;
      case 1:
        bVar64 = false;
        pcVar53 = "<foo/>";
        break;
      case 2:
        bVar64 = false;
        pcVar53 = anon_var_dwarf_197;
        break;
      case 3:
        bVar64 = false;
        pcVar53 = " 2ab ";
        break;
      default:
        bVar64 = true;
        pcVar53 = (char *)0x0;
      }
      uVar56 = 0xffffffff;
      if (uVar49 < 4) {
        uVar56 = *puVar60;
      }
      if ((!bVar64) && (iVar3 = xmlStrlen(pcVar53), iVar3 < (int)uVar56)) {
        uVar56 = 0;
      }
      pxVar32 = (xmlNodePtr)(ulong)uVar56;
      pxVar43 = (xmlNodePtr)xmlNewTextLen(pcVar53);
      desret_xmlNodePtr(pxVar43);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewTextLen",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",uVar41);
        pxVar32 = (xmlNodePtr)(ulong)uVar49;
        printf(" %d");
        putchar(10);
      }
      uVar49 = uVar49 + 1;
      puVar60 = puVar60 + 1;
    } while (uVar49 != 4);
    uVar49 = (int)uVar41 + 1;
    uVar41 = (ulong)uVar49;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar2 = 0;
  do {
    iVar4 = (int)pxVar32;
    iVar3 = xmlMemBlocks();
    pxVar32 = gen_xmlNodePtr(uVar49,iVar4);
    pxVar43 = (xmlNodePtr)xmlNextElementSibling(pxVar32);
    desret_xmlNodePtr(pxVar43);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar49,pxVar32,nr_14);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextElementSibling",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar19 = iVar19 + iVar7 + iVar8 + test_ret;
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar43 = (xmlNodePtr)0x0;
    do {
      iVar5 = (int)pxVar32;
      iVar4 = xmlMemBlocks();
      pxVar32 = gen_xmlNodePtr(uVar49,iVar5);
      uVar56 = (uint)pxVar43;
      if (uVar56 < 4) {
        uVar37 = *puVar62;
      }
      else {
        uVar37 = 0;
      }
      xmlNodeAddContent(pxVar32,uVar37);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,pxVar32,nr_15);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeAddContent",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar32 = pxVar43;
      }
      uVar56 = uVar56 + 1;
      pxVar43 = (xmlNodePtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    uVar41 = 0;
    do {
      pxVar43 = (xmlNodePtr)0x0;
      piVar63 = &DAT_00157174;
      do {
        iVar7 = (int)pxVar32;
        iVar6 = xmlMemBlocks();
        pxVar32 = gen_xmlNodePtr(iVar5,iVar7);
        switch(uVar41) {
        case 0:
          bVar64 = false;
          pcVar53 = "foo";
          break;
        case 1:
          bVar64 = false;
          pcVar53 = "<foo/>";
          break;
        case 2:
          bVar64 = false;
          pcVar53 = anon_var_dwarf_197;
          break;
        case 3:
          bVar64 = false;
          pcVar53 = " 2ab ";
          break;
        default:
          bVar64 = true;
          pcVar53 = (char *)0x0;
        }
        iVar7 = -1;
        uVar49 = (uint)pxVar43;
        if (uVar49 < 4) {
          iVar7 = *piVar63;
        }
        if ((!bVar64) && (iVar8 = xmlStrlen(pcVar53), iVar8 < iVar7)) {
          iVar7 = 0;
        }
        xmlNodeAddContentLen(pxVar32,pcVar53,iVar7);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar5,pxVar32,nr_16);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeAddContentLen",(ulong)(uint)(iVar7 - iVar6));
          iVar4 = iVar4 + 1;
          printf(" %d",iVar5);
          printf(" %d",uVar41);
          printf(" %d");
          putchar(10);
          pxVar32 = pxVar43;
        }
        uVar49 = uVar49 + 1;
        pxVar43 = (xmlNodePtr)(ulong)uVar49;
        piVar63 = piVar63 + 1;
      } while (uVar49 != 4);
      uVar49 = (int)uVar41 + 1;
      uVar41 = (ulong)uVar49;
    } while (uVar49 != 5);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)pxVar32;
    iVar6 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(iVar5,iVar7);
    pxVar32 = (xmlNodePtr)0x0;
    xmlNodeBufGetContent(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeBufGetContent",(ulong)(uint)(iVar7 - iVar6));
      test_ret_17 = test_ret_17 + 1;
      printf(" %d");
      pxVar32 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      do {
        uVar57 = 0;
        do {
          pxVar43 = (xmlNodePtr)0x0;
          puVar46 = &DAT_00157174;
          do {
            iVar6 = (int)pxVar32;
            iVar5 = xmlMemBlocks();
            pxVar33 = gen_xmlBufferPtr(uVar49,iVar6);
            pxVar40 = gen_xmlDocPtr(uVar56,iVar6);
            pxVar32 = gen_xmlNodePtr(uVar58,iVar6);
            uVar55 = 0xffffffff;
            uVar52 = 0xffffffff;
            if (uVar57 < 4) {
              uVar52 = (&DAT_00157174)[uVar57];
            }
            uVar51 = (uint)pxVar43;
            if (uVar51 < 4) {
              uVar55 = *puVar46;
            }
            xmlNodeDump(pxVar33,pxVar40,pxVar32,uVar52,uVar55);
            call_tests = call_tests + 1;
            iVar6 = extraout_EDX_21;
            if (pxVar33 != (xmlBufferPtr)0x0) {
              xmlBufferFree(pxVar33);
              iVar6 = extraout_EDX_22;
            }
            if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc))
            {
              xmlFreeDoc(pxVar40);
              iVar6 = extraout_EDX_23;
            }
            des_xmlNodePtr(uVar58,pxVar32,iVar6);
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlNodeDump",(ulong)(uint)(iVar6 - iVar5));
              test_ret_18 = test_ret_18 + 1;
              printf(" %d",(ulong)uVar49);
              printf(" %d",(ulong)uVar56);
              printf(" %d",(ulong)uVar58);
              printf(" %d",(ulong)uVar57);
              printf(" %d");
              putchar(10);
              pxVar32 = pxVar43;
            }
            uVar51 = uVar51 + 1;
            pxVar43 = (xmlNodePtr)(ulong)uVar51;
            puVar46 = puVar46 + 1;
          } while (uVar51 != 4);
          uVar57 = uVar57 + 1;
        } while (uVar57 != 4);
        uVar58 = uVar58 + 1;
      } while (uVar58 != 3);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  _test_ret_16 = &DAT_00157174;
  iVar5 = 0;
  _test_ret_3 = 0;
  do {
    uVar49 = 0;
    do {
      uVar56 = 0;
      do {
        uVar58 = 0;
        do {
          uVar57 = 0;
          do {
            puVar62 = &DAT_00159d48;
            pxVar43 = (xmlNodePtr)0x0;
            do {
              iVar7 = (int)pxVar32;
              iVar6 = xmlMemBlocks();
              if (test_ret_3 == 0) {
                iVar7 = 0;
                lVar36 = xmlOutputBufferCreateFilename("test.out",0,0);
              }
              else {
                lVar36 = 0;
              }
              pxVar40 = gen_xmlDocPtr(uVar49,iVar7);
              pxVar32 = gen_xmlNodePtr(uVar56,iVar7);
              uVar55 = 0xffffffff;
              uVar52 = 0xffffffff;
              if (uVar58 < 4) {
                uVar52 = (&DAT_00157174)[uVar58];
              }
              if (uVar57 < 4) {
                uVar55 = (&DAT_00157174)[uVar57];
              }
              uVar51 = (uint)pxVar43;
              if (uVar51 < 3) {
                uVar37 = *puVar62;
              }
              else {
                uVar37 = 0;
              }
              xmlNodeDumpOutput(lVar36,pxVar40,pxVar32,uVar52,uVar55,uVar37);
              call_tests = call_tests + 1;
              iVar7 = extraout_EDX_24;
              if (lVar36 != 0) {
                xmlOutputBufferClose(lVar36);
                iVar7 = extraout_EDX_25;
              }
              if (((pxVar40 != (xmlDocPtr)0x0) && (api_doc != pxVar40)) && (pxVar40->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar40);
                iVar7 = extraout_EDX_26;
              }
              des_xmlNodePtr(uVar56,pxVar32,iVar7);
              xmlResetLastError();
              iVar7 = xmlMemBlocks();
              if (iVar6 != iVar7) {
                iVar7 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNodeDumpOutput",(ulong)(uint)(iVar7 - iVar6));
                iVar5 = iVar5 + 1;
                printf(" %d",_test_ret_3);
                printf(" %d",(ulong)uVar49);
                printf(" %d",(ulong)uVar56);
                printf(" %d",(ulong)uVar58);
                printf(" %d",(ulong)uVar57);
                printf(" %d");
                putchar(10);
                pxVar32 = pxVar43;
              }
              uVar51 = uVar51 + 1;
              pxVar43 = (xmlNodePtr)(ulong)uVar51;
              puVar62 = puVar62 + 1;
            } while (uVar51 != 4);
            uVar57 = uVar57 + 1;
          } while (uVar57 != 4);
          uVar58 = uVar58 + 1;
        } while (uVar58 != 4);
        uVar56 = uVar56 + 1;
      } while (uVar56 != 3);
      uVar49 = uVar49 + 1;
    } while (uVar49 != 4);
    bVar64 = test_ret_3 == 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
  } while (bVar64);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    uVar56 = 0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      if (uVar56 < 4) {
        uVar54 = *puVar62;
      }
      else {
        uVar54 = 0;
      }
      xmlNodeGetAttrValue(0,uVar37,uVar54,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeGetAttrValue",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  lVar36 = xmlNodeGetBase(0);
  if (lVar36 != 0) {
    (*_xmlFree)(lVar36);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetBase");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlNodeGetBaseSafe(0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetBaseSafe");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  lVar36 = xmlNodeGetContent(0);
  if (lVar36 != 0) {
    (*_xmlFree)(lVar36);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar11 != iVar20) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar50 = xmlMemBlocks();
  lVar36 = xmlNodeGetLang(0);
  if (lVar36 != 0) {
    (*_xmlFree)(lVar36);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar50 != iVar12) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetLang");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  xmlNodeGetSpacePreserve(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar14 != iVar13) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetSpacePreserve");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  xmlNodeIsText(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeIsText");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar49 = 0;
  test_ret = 0;
  do {
    iVar17 = xmlMemBlocks();
    uVar52 = 0xffffffff;
    if (uVar49 < 4) {
      uVar52 = *_test_ret_16;
    }
    pxVar40 = (xmlDocPtr)0x0;
    lVar36 = xmlNodeListGetRawString(0,0,uVar52);
    if (lVar36 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeListGetRawString",(ulong)(uint)(iVar18 - iVar17));
      test_ret = test_ret + 1;
      printf(" %d",0);
      printf(" %d",0);
      pxVar40 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    _test_ret_16 = _test_ret_16 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    pxVar34 = (xmlDocPtr)0x0;
    do {
      iVar18 = (int)pxVar40;
      iVar17 = xmlMemBlocks();
      pxVar39 = gen_xmlDocPtr(uVar49,iVar18);
      uVar52 = 0xffffffff;
      uVar56 = (uint)pxVar34;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      pxVar40 = (xmlDocPtr)0x0;
      lVar36 = xmlNodeListGetString(pxVar39,0,uVar52);
      if (lVar36 != 0) {
        (*_xmlFree)(lVar36);
      }
      call_tests = call_tests + 1;
      if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
        xmlFreeDoc(pxVar39);
      }
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeListGetString",(ulong)(uint)(iVar18 - iVar17));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        pxVar40 = pxVar34;
      }
      uVar56 = uVar56 + 1;
      pxVar34 = (xmlDocPtr)(ulong)uVar56;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar34 = (xmlDocPtr)0x0;
    do {
      iVar59 = (int)pxVar40;
      iVar18 = xmlMemBlocks();
      pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar59);
      uVar56 = (uint)pxVar34;
      if (uVar56 < 4) {
        uVar37 = *puVar62;
      }
      else {
        uVar37 = 0;
      }
      xmlNodeSetBase(pxVar40,uVar37);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_17);
      xmlResetLastError();
      iVar59 = xmlMemBlocks();
      if (iVar18 != iVar59) {
        iVar59 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetBase",(ulong)(uint)(iVar59 - iVar18));
        iVar17 = iVar17 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar40 = pxVar34;
      }
      uVar56 = uVar56 + 1;
      pxVar34 = (xmlDocPtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  iVar19 = iVar19 + iVar1 + iVar2 + iVar3 + iVar4 + test_ret_17 + test_ret_18 + iVar5 + iVar6 +
           (uint)(iVar7 != iVar8) + (uint)(iVar9 != iVar10) + (uint)(iVar11 != iVar20) +
           (uint)(iVar50 != iVar12) + (uint)(iVar14 != iVar13) + (uint)(iVar15 != iVar16) + test_ret
  ;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar34 = (xmlDocPtr)0x0;
    do {
      iVar3 = (int)pxVar40;
      iVar2 = xmlMemBlocks();
      pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar3);
      uVar56 = (uint)pxVar34;
      if (uVar56 < 4) {
        uVar37 = *puVar62;
      }
      else {
        uVar37 = 0;
      }
      xmlNodeSetContent(pxVar40,uVar37);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_18);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetContent",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar40 = pxVar34;
      }
      uVar56 = uVar56 + 1;
      pxVar34 = (xmlDocPtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  iVar2 = 0;
  do {
    uVar41 = 0;
    do {
      pxVar34 = (xmlDocPtr)0x0;
      piVar63 = &DAT_00157174;
      do {
        iVar4 = (int)pxVar40;
        iVar3 = xmlMemBlocks();
        pxVar40 = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar4);
        switch(uVar41) {
        case 0:
          bVar64 = false;
          pcVar53 = "foo";
          break;
        case 1:
          bVar64 = false;
          pcVar53 = "<foo/>";
          break;
        case 2:
          bVar64 = false;
          pcVar53 = anon_var_dwarf_197;
          break;
        case 3:
          bVar64 = false;
          pcVar53 = " 2ab ";
          break;
        default:
          bVar64 = true;
          pcVar53 = (char *)0x0;
        }
        iVar4 = -1;
        uVar49 = (uint)pxVar34;
        if (uVar49 < 4) {
          iVar4 = *piVar63;
        }
        if ((!bVar64) && (iVar5 = xmlStrlen(pcVar53), iVar5 < iVar4)) {
          iVar4 = 0;
        }
        xmlNodeSetContentLen(pxVar40,pcVar53,iVar4);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar2,(xmlNodePtr)pxVar40,nr_19);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeSetContentLen",(ulong)(uint)(iVar4 - iVar3));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",iVar2);
          printf(" %d",uVar41);
          printf(" %d");
          putchar(10);
          pxVar40 = pxVar34;
        }
        uVar49 = uVar49 + 1;
        pxVar34 = (xmlDocPtr)(ulong)uVar49;
        piVar63 = piVar63 + 1;
      } while (uVar49 != 4);
      uVar49 = (int)uVar41 + 1;
      uVar41 = (ulong)uVar49;
    } while (uVar49 != 5);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar34 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar40;
      iVar3 = xmlMemBlocks();
      pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar4);
      uVar56 = (uint)pxVar34;
      if (uVar56 < 4) {
        uVar37 = *puVar62;
      }
      else {
        uVar37 = 0;
      }
      xmlNodeSetLang(pxVar40,uVar37);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_20);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetLang",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar40 = pxVar34;
      }
      uVar56 = uVar56 + 1;
      pxVar34 = (xmlDocPtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    pxVar34 = (xmlDocPtr)0x0;
    do {
      iVar5 = (int)pxVar40;
      iVar4 = xmlMemBlocks();
      pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar5);
      uVar56 = (uint)pxVar34;
      if (uVar56 < 4) {
        uVar37 = *puVar62;
      }
      else {
        uVar37 = 0;
      }
      xmlNodeSetName(pxVar40,uVar37);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_21);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetName",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar40 = pxVar34;
      }
      uVar56 = uVar56 + 1;
      pxVar34 = (xmlDocPtr)(ulong)uVar56;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    pxVar34 = (xmlDocPtr)0x0;
    do {
      iVar6 = (int)pxVar40;
      iVar5 = xmlMemBlocks();
      pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar6);
      uVar52 = 0xffffffff;
      uVar56 = (uint)pxVar34;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      xmlNodeSetSpacePreserve(pxVar40,uVar52);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_22);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetSpacePreserve",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar40 = pxVar34;
      }
      uVar56 = uVar56 + 1;
      pxVar34 = (xmlDocPtr)(ulong)uVar56;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)pxVar40;
    iVar6 = xmlMemBlocks();
    pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar7);
    pxVar32 = (xmlNodePtr)xmlPreviousElementSibling(pxVar40);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_23);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPreviousElementSibling",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      pxVar40 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar7 = (int)pxVar40;
      iVar8 = xmlMemBlocks();
      pxVar34 = gen_xmlDocPtr(uVar49,iVar7);
      pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar56,iVar7);
      xmlReconciliateNs(pxVar34,pxVar40);
      call_tests = call_tests + 1;
      iVar7 = extraout_EDX_27;
      if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
        xmlFreeDoc(pxVar34);
        iVar7 = extraout_EDX_28;
      }
      des_xmlNodePtr(uVar56,(xmlNodePtr)pxVar40,iVar7);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar8 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReconciliateNs",(ulong)(uint)(iVar7 - iVar8));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar40 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar35 = gen_xmlAttrPtr(uVar49,(int)pxVar40);
    xmlRemoveProp(pxVar35);
    call_tests = call_tests + 1;
    if (uVar49 == 0) {
      xmlFreeDoc(api_doc);
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRemoveProp",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      pxVar40 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
  } while (uVar49 == 1);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar8 = 0;
  do {
    uVar56 = 0;
    do {
      iVar10 = (int)pxVar40;
      iVar9 = xmlMemBlocks();
      pxVar32 = gen_xmlNodePtr(uVar49,iVar10);
      if (uVar56 == 0) {
        pxVar34 = (xmlDocPtr)xmlNewPI("test",0);
      }
      else {
        pxVar34 = (xmlDocPtr)0x0;
      }
      pxVar40 = pxVar34;
      xmlReplaceNode(pxVar32);
      if (pxVar34 != (xmlDocPtr)0x0) {
        xmlUnlinkNode(pxVar34);
        xmlFreeNode(pxVar34);
      }
      if (pxVar32 != (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxVar32);
        xmlFreeNode(pxVar32);
      }
      call_tests = call_tests + 1;
      if (uVar49 == 1) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReplaceNode",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar40 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar11 = (int)pxVar40;
      iVar10 = xmlMemBlocks();
      if (uVar49 < 5) {
        puVar48 = (&PTR_anon_var_dwarf_677_00159d20)[uVar49];
      }
      else {
        puVar48 = (undefined *)0x0;
      }
      pxVar34 = gen_xmlDocPtr(uVar56,iVar11);
      pxVar40 = pxVar34;
      xmlSaveFile(puVar48);
      call_tests = call_tests + 1;
      if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
        xmlFreeDoc(pxVar34);
      }
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveFile",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar40 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 6);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar41 = 0;
  do {
    uVar49 = 0;
    do {
      pxVar34 = (xmlDocPtr)0x0;
      puVar62 = &DAT_00159d48;
      do {
        iVar20 = (int)pxVar40;
        iVar11 = xmlMemBlocks();
        if ((uint)uVar41 < 5) {
          puVar48 = (&PTR_anon_var_dwarf_677_00159d20)[uVar41];
        }
        else {
          puVar48 = (undefined *)0x0;
        }
        pxVar39 = gen_xmlDocPtr(uVar49,iVar20);
        uVar56 = (uint)pxVar34;
        if (uVar56 < 3) {
          uVar37 = *puVar62;
        }
        else {
          uVar37 = 0;
        }
        pxVar40 = pxVar39;
        xmlSaveFileEnc(puVar48,pxVar39,uVar37);
        call_tests = call_tests + 1;
        if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
          xmlFreeDoc(pxVar39);
        }
        xmlResetLastError();
        iVar20 = xmlMemBlocks();
        if (iVar11 != iVar20) {
          iVar20 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileEnc",(ulong)(uint)(iVar20 - iVar11));
          iVar10 = iVar10 + 1;
          printf(" %d",uVar41);
          printf(" %d",(ulong)uVar49);
          printf(" %d");
          putchar(10);
          pxVar40 = pxVar34;
        }
        uVar56 = uVar56 + 1;
        pxVar34 = (xmlDocPtr)(ulong)uVar56;
        puVar62 = puVar62 + 1;
      } while (uVar56 != 4);
      uVar49 = uVar49 + 1;
    } while (uVar49 != 4);
    uVar49 = (uint)uVar41 + 1;
    uVar41 = (ulong)uVar49;
  } while (uVar49 != 6);
  function_tests = function_tests + 1;
  iVar11 = 0;
  _test_ret = 0;
  do {
    uVar49 = 0;
    do {
      pxVar34 = (xmlDocPtr)0x0;
      puVar62 = &DAT_00159d48;
      do {
        iVar50 = (int)pxVar40;
        iVar20 = xmlMemBlocks();
        if (test_ret == 0) {
          iVar50 = 0;
          uVar37 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          uVar37 = 0;
        }
        pxVar39 = gen_xmlDocPtr(uVar49,iVar50);
        uVar56 = (uint)pxVar34;
        if (uVar56 < 3) {
          uVar54 = *puVar62;
        }
        else {
          uVar54 = 0;
        }
        pxVar40 = pxVar39;
        xmlSaveFileTo(uVar37,pxVar39,uVar54);
        call_tests = call_tests + 1;
        if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
          xmlFreeDoc(pxVar39);
        }
        xmlResetLastError();
        iVar50 = xmlMemBlocks();
        if (iVar20 != iVar50) {
          iVar50 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileTo",(ulong)(uint)(iVar50 - iVar20));
          iVar11 = iVar11 + 1;
          printf(" %d",_test_ret);
          printf(" %d",(ulong)uVar49);
          printf(" %d");
          putchar(10);
          pxVar40 = pxVar34;
        }
        uVar56 = uVar56 + 1;
        pxVar34 = (xmlDocPtr)(ulong)uVar56;
        puVar62 = puVar62 + 1;
      } while (uVar56 != 4);
      uVar49 = uVar49 + 1;
    } while (uVar49 != 4);
    bVar64 = test_ret == 0;
    _test_ret = (ulong)(test_ret + 1);
  } while (bVar64);
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      pxVar34 = (xmlDocPtr)0x0;
      puVar46 = &DAT_00157174;
      do {
        iVar12 = (int)pxVar40;
        iVar50 = xmlMemBlocks();
        if (uVar49 < 5) {
          puVar48 = (&PTR_anon_var_dwarf_677_00159d20)[uVar49];
        }
        else {
          puVar48 = (undefined *)0x0;
        }
        pxVar39 = gen_xmlDocPtr(uVar56,iVar12);
        uVar52 = 0xffffffff;
        uVar58 = (uint)pxVar34;
        if (uVar58 < 4) {
          uVar52 = *puVar46;
        }
        pxVar40 = pxVar39;
        xmlSaveFormatFile(puVar48,pxVar39,uVar52);
        call_tests = call_tests + 1;
        if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
          xmlFreeDoc(pxVar39);
        }
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar50 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFormatFile",(ulong)(uint)(iVar12 - iVar50));
          iVar20 = iVar20 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          printf(" %d");
          putchar(10);
          pxVar40 = pxVar34;
        }
        uVar58 = uVar58 + 1;
        pxVar34 = (xmlDocPtr)(ulong)uVar58;
        puVar46 = puVar46 + 1;
      } while (uVar58 != 4);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 6);
  function_tests = function_tests + 1;
  iVar50 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar41 = 0;
      do {
        puVar46 = &DAT_00157174;
        pxVar34 = (xmlDocPtr)0x0;
        do {
          iVar14 = (int)pxVar40;
          iVar12 = xmlMemBlocks();
          if (uVar49 < 5) {
            puVar48 = (&PTR_anon_var_dwarf_677_00159d20)[uVar49];
          }
          else {
            puVar48 = (undefined *)0x0;
          }
          pxVar39 = gen_xmlDocPtr(uVar56,iVar14);
          if ((uint)uVar41 < 3) {
            uVar37 = (&DAT_00159d48)[uVar41];
          }
          else {
            uVar37 = 0;
          }
          uVar52 = 0xffffffff;
          uVar58 = (uint)pxVar34;
          if (uVar58 < 4) {
            uVar52 = *puVar46;
          }
          pxVar40 = pxVar39;
          xmlSaveFormatFileEnc(puVar48,pxVar39,uVar37,uVar52);
          call_tests = call_tests + 1;
          if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
            xmlFreeDoc(pxVar39);
          }
          xmlResetLastError();
          iVar14 = xmlMemBlocks();
          if (iVar12 != iVar14) {
            iVar14 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileEnc",(ulong)(uint)(iVar14 - iVar12))
            ;
            iVar50 = iVar50 + 1;
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d",uVar41);
            printf(" %d");
            putchar(10);
            pxVar40 = pxVar34;
          }
          uVar58 = uVar58 + 1;
          pxVar34 = (xmlDocPtr)(ulong)uVar58;
          puVar46 = puVar46 + 1;
        } while (uVar58 != 4);
        uVar58 = (uint)uVar41 + 1;
        uVar41 = (ulong)uVar58;
      } while (uVar58 != 4);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 6);
  function_tests = function_tests + 1;
  iVar12 = 0;
  _test_ret = 0;
  do {
    uVar49 = 0;
    do {
      uVar41 = 0;
      do {
        puVar46 = &DAT_00157174;
        pxVar34 = (xmlDocPtr)0x0;
        do {
          iVar13 = (int)pxVar40;
          iVar14 = xmlMemBlocks();
          if (test_ret == 0) {
            iVar13 = 0;
            uVar37 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            uVar37 = 0;
          }
          pxVar39 = gen_xmlDocPtr(uVar49,iVar13);
          if ((uint)uVar41 < 3) {
            uVar54 = (&DAT_00159d48)[uVar41];
          }
          else {
            uVar54 = 0;
          }
          uVar52 = 0xffffffff;
          uVar56 = (uint)pxVar34;
          if (uVar56 < 4) {
            uVar52 = *puVar46;
          }
          pxVar40 = pxVar39;
          xmlSaveFormatFileTo(uVar37,pxVar39,uVar54,uVar52);
          call_tests = call_tests + 1;
          if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
            xmlFreeDoc(pxVar39);
          }
          xmlResetLastError();
          iVar13 = xmlMemBlocks();
          if (iVar14 != iVar13) {
            iVar13 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileTo",(ulong)(uint)(iVar13 - iVar14));
            iVar12 = iVar12 + 1;
            printf(" %d",_test_ret);
            printf(" %d",(ulong)uVar49);
            printf(" %d",uVar41);
            printf(" %d");
            putchar(10);
            pxVar40 = pxVar34;
          }
          uVar56 = uVar56 + 1;
          pxVar34 = (xmlDocPtr)(ulong)uVar56;
          puVar46 = puVar46 + 1;
        } while (uVar56 != 4);
        uVar56 = (uint)uVar41 + 1;
        uVar41 = (ulong)uVar56;
      } while (uVar56 != 4);
      uVar49 = uVar49 + 1;
    } while (uVar49 != 4);
    bVar64 = test_ret == 0;
    _test_ret = (ulong)(test_ret + 1);
  } while (bVar64);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      pxVar34 = (xmlDocPtr)0x0;
      puVar62 = &DAT_00159d60;
      do {
        iVar13 = (int)pxVar40;
        iVar14 = xmlMemBlocks();
        pxVar39 = gen_xmlDocPtr(uVar49,iVar13);
        pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar56,iVar13);
        uVar58 = (uint)pxVar34;
        if (uVar58 < 4) {
          uVar37 = *puVar62;
        }
        else {
          uVar37 = 0;
        }
        xmlSearchNs(pxVar39,pxVar40,uVar37);
        call_tests = call_tests + 1;
        iVar13 = extraout_EDX_29;
        if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
          xmlFreeDoc(pxVar39);
          iVar13 = extraout_EDX_30;
        }
        des_xmlNodePtr(uVar56,(xmlNodePtr)pxVar40,iVar13);
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar14 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNs",(ulong)(uint)(iVar13 - iVar14));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          printf(" %d");
          putchar(10);
          pxVar40 = pxVar34;
        }
        uVar58 = uVar58 + 1;
        pxVar34 = (xmlDocPtr)(ulong)uVar58;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      pxVar34 = (xmlDocPtr)0x0;
      puVar62 = &DAT_00159d60;
      do {
        iVar15 = (int)pxVar40;
        iVar13 = xmlMemBlocks();
        pxVar39 = gen_xmlDocPtr(uVar49,iVar15);
        pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar56,iVar15);
        uVar58 = (uint)pxVar34;
        if (uVar58 < 4) {
          uVar37 = *puVar62;
        }
        else {
          uVar37 = 0;
        }
        xmlSearchNsByHref(pxVar39,pxVar40,uVar37);
        call_tests = call_tests + 1;
        iVar15 = extraout_EDX_31;
        if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
          xmlFreeDoc(pxVar39);
          iVar15 = extraout_EDX_32;
        }
        des_xmlNodePtr(uVar56,(xmlNodePtr)pxVar40,iVar15);
        xmlResetLastError();
        iVar15 = xmlMemBlocks();
        if (iVar13 != iVar15) {
          iVar15 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNsByHref",(ulong)(uint)(iVar15 - iVar13));
          iVar14 = iVar14 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          printf(" %d");
          putchar(10);
          pxVar40 = pxVar34;
        }
        uVar58 = uVar58 + 1;
        pxVar34 = (xmlDocPtr)(ulong)uVar58;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  uVar49 = 0xffffffff;
  iVar13 = 0;
  do {
    iVar15 = xmlMemBlocks();
    uVar52 = 0;
    if (uVar49 < 3) {
      uVar52 = (&DAT_0014b204)[uVar49];
    }
    uVar49 = uVar49 + 1;
    xmlSetBufferAllocationScheme(uVar52);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetBufferAllocationScheme",
             (ulong)(uint)(iVar16 - iVar15));
      iVar13 = iVar13 + 1;
      pxVar40 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
  } while (uVar49 != 3);
  iVar1 = iVar19 + test_ret_1 + iVar17 + iVar1 + test_ret_2 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6
          + iVar7 + iVar8 + iVar9 + iVar10 + iVar11 + iVar20 + iVar50 + iVar12 + test_ret;
  function_tests = function_tests + 1;
  puVar46 = &DAT_00157174;
  uVar49 = 0;
  iVar19 = 0;
  do {
    iVar2 = xmlMemBlocks();
    uVar52 = 0xffffffff;
    if (uVar49 < 4) {
      uVar52 = *puVar46;
    }
    xmlSetCompressMode(uVar52);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetCompressMode",(ulong)(uint)(iVar3 - iVar2));
      iVar19 = iVar19 + 1;
      pxVar40 = (xmlDocPtr)(ulong)uVar49;
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar46 = puVar46 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar49 = 0;
  do {
    puVar60 = &DAT_00157174;
    pxVar34 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar40;
      iVar3 = xmlMemBlocks();
      pxVar39 = gen_xmlDocPtr(uVar49,iVar4);
      pxVar40 = (xmlDocPtr)0xffffffff;
      uVar56 = (uint)pxVar34;
      if (uVar56 < 4) {
        pxVar40 = (xmlDocPtr)(ulong)*puVar60;
      }
      xmlSetDocCompressMode(pxVar39);
      call_tests = call_tests + 1;
      if (((pxVar39 != (xmlDocPtr)0x0) && (api_doc != pxVar39)) && (pxVar39->doc != api_doc)) {
        xmlFreeDoc(pxVar39);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetDocCompressMode",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pxVar40 = pxVar34;
      }
      uVar56 = uVar56 + 1;
      pxVar34 = (xmlDocPtr)(ulong)uVar56;
      puVar60 = puVar60 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar5 = (int)pxVar40;
      iVar4 = xmlMemBlocks();
      pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar5);
      if (uVar56 == 0) {
        get_api_root();
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
        }
        xmlSetNs(pxVar40,api_ns);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_25);
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      else {
        xmlSetNs(pxVar40,0);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,nr_24);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetNs",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar49);
        pxVar40 = (xmlDocPtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 == 1);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    uVar49 = 0;
    do {
      uVar56 = 0;
      do {
        puVar62 = &DAT_00159d60;
        pxVar34 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)pxVar40;
          iVar6 = xmlMemBlocks();
          pxVar40 = (xmlDocPtr)gen_xmlNodePtr(iVar5,iVar7);
          if (uVar49 == 0) {
            get_api_root();
            pxVar47 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              pxVar47 = api_root->nsDef;
              api_ns = pxVar47;
            }
          }
          else {
            pxVar47 = (xmlNs *)0x0;
          }
          if (uVar56 < 4) {
            uVar37 = (&DAT_00159d60)[uVar56];
          }
          else {
            uVar37 = 0;
          }
          uVar58 = (uint)pxVar34;
          if (uVar58 < 4) {
            uVar54 = *puVar62;
          }
          else {
            uVar54 = 0;
          }
          auVar65 = xmlSetNsProp(pxVar40,pxVar47,uVar37,uVar54);
          iVar7 = auVar65._8_4_;
          lVar36 = auVar65._0_8_;
          if (lVar36 != 0) {
            xmlUnlinkNode(lVar36);
            xmlFreeNode(lVar36);
            iVar7 = extraout_EDX_33;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar5,(xmlNodePtr)pxVar40,iVar7);
          if (uVar49 == 0) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSetNsProp",(ulong)(uint)(iVar7 - iVar6));
            iVar4 = iVar4 + 1;
            printf(" %d",iVar5);
            printf(" %d",(ulong)uVar49);
            printf(" %d",(ulong)uVar56);
            printf(" %d");
            putchar(10);
            pxVar40 = pxVar34;
          }
          uVar58 = uVar58 + 1;
          pxVar34 = (xmlDocPtr)(ulong)uVar58;
          puVar62 = puVar62 + 1;
        } while (uVar58 != 5);
        uVar56 = uVar56 + 1;
      } while (uVar56 != 5);
      bVar64 = uVar49 == 0;
      uVar49 = uVar49 + 1;
    } while (bVar64);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      pxVar34 = (xmlDocPtr)0x0;
      puVar62 = &DAT_00159d60;
      do {
        iVar6 = (int)pxVar40;
        iVar5 = xmlMemBlocks();
        pxVar40 = (xmlDocPtr)gen_xmlNodePtr(uVar49,iVar6);
        if (uVar56 < 4) {
          uVar37 = (&DAT_00159d60)[uVar56];
        }
        else {
          uVar37 = 0;
        }
        uVar58 = (uint)pxVar34;
        if (uVar58 < 4) {
          uVar54 = *puVar62;
        }
        else {
          uVar54 = 0;
        }
        auVar65 = xmlSetProp(pxVar40,uVar37,uVar54);
        iVar6 = auVar65._8_4_;
        lVar36 = auVar65._0_8_;
        if (lVar36 != 0) {
          xmlUnlinkNode(lVar36);
          xmlFreeNode(lVar36);
          iVar6 = extraout_EDX_34;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar49,(xmlNodePtr)pxVar40,iVar6);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetProp",(ulong)(uint)(iVar6 - iVar5));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          printf(" %d");
          putchar(10);
          pxVar40 = pxVar34;
        }
        uVar58 = uVar58 + 1;
        pxVar34 = (xmlDocPtr)(ulong)uVar58;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      uVar56 = uVar56 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  puVar62 = &DAT_00159d60;
  iVar5 = 0;
  uVar49 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar49 < 4) {
      uVar37 = *puVar62;
    }
    else {
      uVar37 = 0;
    }
    lVar36 = xmlSplitQName2(uVar37,0);
    if (lVar36 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSplitQName2",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar62 = puVar62 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  puVar62 = &DAT_00159d60;
  iVar6 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      uVar54 = 0;
      if (uVar56 == 0) {
        uVar54 = 0x15c404;
      }
      xmlSplitQName3(uVar37,uVar54);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName3",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d",(ulong)uVar56);
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 == 1);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar49 < 4) {
      uVar37 = *puVar62;
    }
    else {
      uVar37 = 0;
    }
    pxVar32 = (xmlNodePtr)xmlStringGetNodeList(0,uVar37);
    desret_xmlNodePtr(pxVar32);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStringGetNodeList",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar49 = uVar49 + 1;
    puVar62 = puVar62 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar8 = 0;
  do {
    piVar63 = &DAT_00157174;
    pxVar32 = (xmlNodePtr)0x0;
    do {
      iVar9 = xmlMemBlocks();
      switch(uVar49) {
      case 0:
        bVar64 = false;
        pcVar53 = "foo";
        break;
      case 1:
        bVar64 = false;
        pcVar53 = "<foo/>";
        break;
      case 2:
        bVar64 = false;
        pcVar53 = anon_var_dwarf_197;
        break;
      case 3:
        bVar64 = false;
        pcVar53 = " 2ab ";
        break;
      default:
        bVar64 = true;
        pcVar53 = (char *)0x0;
      }
      iVar10 = -1;
      uVar56 = (uint)pxVar32;
      if (uVar56 < 4) {
        iVar10 = *piVar63;
      }
      if ((!bVar64) && (iVar11 = xmlStrlen(pcVar53), iVar11 < iVar10)) {
        iVar10 = 0;
      }
      pxVar43 = (xmlNodePtr)xmlStringLenGetNodeList(0,pcVar53,iVar10);
      desret_xmlNodePtr(pxVar43);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStringLenGetNodeList",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar49);
        printf(" %d");
        putchar(10);
        pcVar53 = (char *)pxVar32;
      }
      uVar56 = uVar56 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar56;
      piVar63 = piVar63 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar9 = 0;
  iVar10 = 0;
  do {
    uVar41 = 0;
    do {
      pxVar32 = (xmlNodePtr)0x0;
      piVar63 = &DAT_00157174;
      do {
        iVar20 = (int)pcVar53;
        iVar11 = xmlMemBlocks();
        pcVar53 = (char *)gen_xmlNodePtr(iVar10,iVar20);
        switch(uVar41) {
        case 0:
          bVar64 = false;
          pcVar61 = "foo";
          break;
        case 1:
          bVar64 = false;
          pcVar61 = "<foo/>";
          break;
        case 2:
          bVar64 = false;
          pcVar61 = anon_var_dwarf_197;
          break;
        case 3:
          bVar64 = false;
          pcVar61 = " 2ab ";
          break;
        default:
          bVar64 = true;
          pcVar61 = (char *)0x0;
        }
        iVar20 = -1;
        uVar49 = (uint)pxVar32;
        if (uVar49 < 4) {
          iVar20 = *piVar63;
        }
        if ((!bVar64) && (iVar50 = xmlStrlen(pcVar61), iVar50 < iVar20)) {
          iVar20 = 0;
        }
        xmlTextConcat(pcVar53,pcVar61,iVar20);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar10,(xmlNodePtr)pcVar53,nr_26);
        xmlResetLastError();
        iVar20 = xmlMemBlocks();
        if (iVar11 != iVar20) {
          iVar20 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextConcat",(ulong)(uint)(iVar20 - iVar11));
          iVar9 = iVar9 + 1;
          printf(" %d",iVar10);
          printf(" %d",uVar41);
          printf(" %d");
          putchar(10);
          pcVar53 = (char *)pxVar32;
        }
        uVar49 = uVar49 + 1;
        pxVar32 = (xmlNodePtr)(ulong)uVar49;
        piVar63 = piVar63 + 1;
      } while (uVar49 != 4);
      uVar49 = (int)uVar41 + 1;
      uVar41 = (ulong)uVar49;
    } while (uVar49 != 5);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  function_tests = function_tests + 1;
  uVar49 = 0;
  iVar10 = 0;
  do {
    uVar56 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar49 == 0) {
        pxVar32 = (xmlNodePtr)xmlNewPI("test",0);
      }
      else {
        pxVar32 = (xmlNodePtr)0x0;
      }
      if (uVar56 == 0) {
        pxVar43 = (xmlNodePtr)xmlNewPI("test",0);
      }
      else {
        pxVar43 = (xmlNodePtr)0x0;
      }
      val = pxVar43;
      pxVar44 = (xmlNodePtr)xmlTextMerge(pxVar32);
      if (pxVar44 == (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxVar43);
        xmlFreeNode(pxVar43);
        pxVar44 = pxVar32;
      }
      desret_xmlNodePtr(pxVar44);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      if (iVar11 != iVar20) {
        iVar20 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextMerge",(ulong)(uint)(iVar20 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",(ulong)uVar49);
        val = (xmlNodePtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != 3);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar49 = 0;
  do {
    uVar56 = 0;
    do {
      uVar58 = 0;
      puVar62 = &DAT_00159d60;
      do {
        iVar50 = (int)val;
        iVar20 = xmlMemBlocks();
        val = gen_xmlNodePtr(uVar49,iVar50);
        if (uVar56 == 0) {
          get_api_root();
          pxVar47 = api_ns;
          if (api_root != (xmlNodePtr)0x0) {
            pxVar47 = api_root->nsDef;
            api_ns = pxVar47;
          }
        }
        else {
          pxVar47 = (xmlNs *)0x0;
        }
        if (uVar58 < 4) {
          uVar37 = *puVar62;
        }
        else {
          uVar37 = 0;
        }
        xmlUnsetNsProp(val,pxVar47,uVar37);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar49,val,nr_27);
        if (uVar56 == 0) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar50 = xmlMemBlocks();
        if (iVar20 != iVar50) {
          iVar50 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUnsetNsProp",(ulong)(uint)(iVar50 - iVar20));
          iVar11 = iVar11 + 1;
          printf(" %d",(ulong)uVar49);
          printf(" %d",(ulong)uVar56);
          val = (xmlNodePtr)(ulong)uVar58;
          printf(" %d");
          putchar(10);
        }
        uVar58 = uVar58 + 1;
        puVar62 = puVar62 + 1;
      } while (uVar58 != 5);
      bVar64 = uVar56 == 0;
      uVar56 = uVar56 + 1;
    } while (bVar64);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar49 = 0;
  do {
    puVar62 = &DAT_00159d60;
    uVar56 = 0;
    do {
      iVar12 = (int)val;
      iVar50 = xmlMemBlocks();
      val = gen_xmlNodePtr(uVar49,iVar12);
      if (uVar56 < 4) {
        uVar37 = *puVar62;
      }
      else {
        uVar37 = 0;
      }
      xmlUnsetProp(val,uVar37);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar49,val,nr_28);
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar50 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUnsetProp",(ulong)(uint)(iVar12 - iVar50));
        iVar20 = iVar20 + 1;
        printf(" %d",(ulong)uVar49);
        val = (xmlNodePtr)(ulong)uVar56;
        printf(" %d");
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar62 = puVar62 + 1;
    } while (uVar56 != 5);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 3);
  function_tests = function_tests + 1;
  iVar50 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    uVar56 = 0;
    do {
      iVar12 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      uVar52 = 0xffffffff;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      xmlValidateNCName(uVar37,uVar52);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar12 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNCName",(ulong)(uint)(iVar15 - iVar12));
        iVar50 = iVar50 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d",(ulong)uVar56);
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    uVar56 = 0;
    do {
      iVar15 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      uVar52 = 0xffffffff;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      xmlValidateNMToken(uVar37,uVar52);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar15 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNMToken",(ulong)(uint)(iVar16 - iVar15));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d",(ulong)uVar56);
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    uVar56 = 0;
    do {
      iVar16 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      uVar52 = 0xffffffff;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      xmlValidateName(uVar37,uVar52);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateName",(ulong)(uint)(iVar17 - iVar16));
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d",(ulong)uVar56);
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar49 = 0;
  do {
    puVar46 = &DAT_00157174;
    uVar56 = 0;
    do {
      iVar17 = xmlMemBlocks();
      if (uVar49 < 4) {
        uVar37 = (&DAT_00159d60)[uVar49];
      }
      else {
        uVar37 = 0;
      }
      uVar52 = 0xffffffff;
      if (uVar56 < 4) {
        uVar52 = *puVar46;
      }
      xmlValidateQName(uVar37,uVar52);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateQName",(ulong)(uint)(iVar18 - iVar17));
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar49);
        printf(" %d",(ulong)uVar56);
        putchar(10);
      }
      uVar56 = uVar56 + 1;
      puVar46 = puVar46 + 1;
    } while (uVar56 != 4);
    uVar49 = uVar49 + 1;
  } while (uVar49 != 5);
  function_tests = function_tests + 1;
  uVar49 = iVar1 + iVar14 + iVar13 + iVar19 + iVar2 + iVar3 + iVar4 + test_ret + iVar5 + iVar6 +
           iVar7 + iVar8 + iVar9 + iVar10 + iVar11 + iVar20 + iVar50 + iVar12 + iVar15 + iVar16;
  if (uVar49 != 0) {
    printf("Module tree: %d errors\n",(ulong)uVar49);
  }
  return uVar49;
}

Assistant:

static int
test_tree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing tree : 144 of 170 functions ...\n");
    test_ret += test_xmlAddChild();
    test_ret += test_xmlAddChildList();
    test_ret += test_xmlAddNextSibling();
    test_ret += test_xmlAddPrevSibling();
    test_ret += test_xmlAddSibling();
    test_ret += test_xmlAttrSerializeTxtContent();
    test_ret += test_xmlBufContent();
    test_ret += test_xmlBufEnd();
    test_ret += test_xmlBufGetNodeContent();
    test_ret += test_xmlBufNodeDump();
    test_ret += test_xmlBufShrink();
    test_ret += test_xmlBufUse();
    test_ret += test_xmlBufferAdd();
    test_ret += test_xmlBufferAddHead();
    test_ret += test_xmlBufferCCat();
    test_ret += test_xmlBufferCat();
    test_ret += test_xmlBufferContent();
    test_ret += test_xmlBufferCreate();
    test_ret += test_xmlBufferCreateSize();
    test_ret += test_xmlBufferCreateStatic();
    test_ret += test_xmlBufferDetach();
    test_ret += test_xmlBufferEmpty();
    test_ret += test_xmlBufferGrow();
    test_ret += test_xmlBufferLength();
    test_ret += test_xmlBufferResize();
    test_ret += test_xmlBufferSetAllocationScheme();
    test_ret += test_xmlBufferShrink();
    test_ret += test_xmlBufferWriteCHAR();
    test_ret += test_xmlBufferWriteChar();
    test_ret += test_xmlBufferWriteQuotedString();
    test_ret += test_xmlBuildQName();
    test_ret += test_xmlChildElementCount();
    test_ret += test_xmlCopyDoc();
    test_ret += test_xmlCopyDtd();
    test_ret += test_xmlCopyNamespace();
    test_ret += test_xmlCopyNamespaceList();
    test_ret += test_xmlCopyNode();
    test_ret += test_xmlCopyNodeList();
    test_ret += test_xmlCopyProp();
    test_ret += test_xmlCopyPropList();
    test_ret += test_xmlCreateIntSubset();
    test_ret += test_xmlDOMWrapAdoptNode();
    test_ret += test_xmlDOMWrapCloneNode();
    test_ret += test_xmlDOMWrapNewCtxt();
    test_ret += test_xmlDOMWrapReconcileNamespaces();
    test_ret += test_xmlDOMWrapRemoveNode();
    test_ret += test_xmlDeregisterNodeDefault();
    test_ret += test_xmlDocCopyNode();
    test_ret += test_xmlDocCopyNodeList();
    test_ret += test_xmlDocDump();
    test_ret += test_xmlDocDumpFormatMemory();
    test_ret += test_xmlDocDumpFormatMemoryEnc();
    test_ret += test_xmlDocDumpMemory();
    test_ret += test_xmlDocDumpMemoryEnc();
    test_ret += test_xmlDocFormatDump();
    test_ret += test_xmlDocGetRootElement();
    test_ret += test_xmlDocSetRootElement();
    test_ret += test_xmlElemDump();
    test_ret += test_xmlFirstElementChild();
    test_ret += test_xmlGetBufferAllocationScheme();
    test_ret += test_xmlGetCompressMode();
    test_ret += test_xmlGetDocCompressMode();
    test_ret += test_xmlGetIntSubset();
    test_ret += test_xmlGetLastChild();
    test_ret += test_xmlGetLineNo();
    test_ret += test_xmlGetNoNsProp();
    test_ret += test_xmlGetNodePath();
    test_ret += test_xmlGetNsList();
    test_ret += test_xmlGetNsListSafe();
    test_ret += test_xmlGetNsProp();
    test_ret += test_xmlGetProp();
    test_ret += test_xmlHasNsProp();
    test_ret += test_xmlHasProp();
    test_ret += test_xmlIsBlankNode();
    test_ret += test_xmlIsXHTML();
    test_ret += test_xmlLastElementChild();
    test_ret += test_xmlNewCDataBlock();
    test_ret += test_xmlNewCharRef();
    test_ret += test_xmlNewChild();
    test_ret += test_xmlNewComment();
    test_ret += test_xmlNewDoc();
    test_ret += test_xmlNewDocComment();
    test_ret += test_xmlNewDocFragment();
    test_ret += test_xmlNewDocNode();
    test_ret += test_xmlNewDocNodeEatName();
    test_ret += test_xmlNewDocPI();
    test_ret += test_xmlNewDocProp();
    test_ret += test_xmlNewDocRawNode();
    test_ret += test_xmlNewDocText();
    test_ret += test_xmlNewDocTextLen();
    test_ret += test_xmlNewDtd();
    test_ret += test_xmlNewNode();
    test_ret += test_xmlNewNodeEatName();
    test_ret += test_xmlNewNs();
    test_ret += test_xmlNewNsProp();
    test_ret += test_xmlNewNsPropEatName();
    test_ret += test_xmlNewPI();
    test_ret += test_xmlNewProp();
    test_ret += test_xmlNewReference();
    test_ret += test_xmlNewText();
    test_ret += test_xmlNewTextChild();
    test_ret += test_xmlNewTextLen();
    test_ret += test_xmlNextElementSibling();
    test_ret += test_xmlNodeAddContent();
    test_ret += test_xmlNodeAddContentLen();
    test_ret += test_xmlNodeBufGetContent();
    test_ret += test_xmlNodeDump();
    test_ret += test_xmlNodeDumpOutput();
    test_ret += test_xmlNodeGetAttrValue();
    test_ret += test_xmlNodeGetBase();
    test_ret += test_xmlNodeGetBaseSafe();
    test_ret += test_xmlNodeGetContent();
    test_ret += test_xmlNodeGetLang();
    test_ret += test_xmlNodeGetSpacePreserve();
    test_ret += test_xmlNodeIsText();
    test_ret += test_xmlNodeListGetRawString();
    test_ret += test_xmlNodeListGetString();
    test_ret += test_xmlNodeSetBase();
    test_ret += test_xmlNodeSetContent();
    test_ret += test_xmlNodeSetContentLen();
    test_ret += test_xmlNodeSetLang();
    test_ret += test_xmlNodeSetName();
    test_ret += test_xmlNodeSetSpacePreserve();
    test_ret += test_xmlPreviousElementSibling();
    test_ret += test_xmlReconciliateNs();
    test_ret += test_xmlRegisterNodeDefault();
    test_ret += test_xmlRemoveProp();
    test_ret += test_xmlReplaceNode();
    test_ret += test_xmlSaveFile();
    test_ret += test_xmlSaveFileEnc();
    test_ret += test_xmlSaveFileTo();
    test_ret += test_xmlSaveFormatFile();
    test_ret += test_xmlSaveFormatFileEnc();
    test_ret += test_xmlSaveFormatFileTo();
    test_ret += test_xmlSearchNs();
    test_ret += test_xmlSearchNsByHref();
    test_ret += test_xmlSetBufferAllocationScheme();
    test_ret += test_xmlSetCompressMode();
    test_ret += test_xmlSetDocCompressMode();
    test_ret += test_xmlSetNs();
    test_ret += test_xmlSetNsProp();
    test_ret += test_xmlSetProp();
    test_ret += test_xmlSplitQName2();
    test_ret += test_xmlSplitQName3();
    test_ret += test_xmlStringGetNodeList();
    test_ret += test_xmlStringLenGetNodeList();
    test_ret += test_xmlTextConcat();
    test_ret += test_xmlTextMerge();
    test_ret += test_xmlThrDefDeregisterNodeDefault();
    test_ret += test_xmlThrDefRegisterNodeDefault();
    test_ret += test_xmlUnsetNsProp();
    test_ret += test_xmlUnsetProp();
    test_ret += test_xmlValidateNCName();
    test_ret += test_xmlValidateNMToken();
    test_ret += test_xmlValidateName();
    test_ret += test_xmlValidateQName();

    if (test_ret != 0)
	printf("Module tree: %d errors\n", test_ret);
    return(test_ret);
}